

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx512::CurveNiIntersectorK<8,4>::
     intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  undefined1 auVar3 [16];
  Primitive PVar4;
  uint uVar5;
  uint uVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  void *pvVar9;
  __int_type_conflict _Var10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  int iVar23;
  int iVar24;
  int iVar25;
  byte bVar26;
  uint uVar27;
  ulong uVar28;
  long lVar30;
  uint uVar31;
  ulong uVar32;
  uint uVar33;
  ulong uVar34;
  ulong uVar35;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar91 [32];
  undefined1 auVar93 [32];
  undefined1 auVar95 [32];
  undefined1 auVar97 [32];
  undefined1 auVar99 [32];
  float fVar101;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar106;
  float fVar107;
  float fVar108;
  float t1;
  undefined4 uVar109;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  float fVar118;
  float fVar119;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float fVar125;
  float fVar132;
  float fVar133;
  float fVar134;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  vfloat4 b0;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  vfloat4 b0_1;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [32];
  vfloat4 a0_2;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  float fVar190;
  float fVar199;
  float fVar200;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  float fVar201;
  float fVar211;
  float fVar212;
  vfloat4 a0_1;
  undefined1 auVar202 [16];
  float fVar213;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  float fVar214;
  float fVar222;
  float fVar223;
  vfloat4 a0;
  undefined1 auVar215 [16];
  float fVar224;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [32];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [32];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 in_ZMM30 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p02;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_368 [16];
  RTCFilterFunctionNArguments local_358;
  undefined1 local_328 [16];
  uint auStack_318 [4];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [8];
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [8];
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [16];
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [8];
  float fStack_170;
  float fStack_16c;
  undefined1 local_168 [32];
  undefined1 local_148 [32];
  undefined8 uStack_128;
  RTCHitN local_108 [16];
  undefined1 local_f8 [16];
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [16];
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar29;
  undefined1 auVar90 [32];
  undefined1 auVar92 [32];
  undefined1 auVar94 [32];
  undefined1 auVar96 [32];
  undefined1 auVar98 [32];
  undefined1 auVar100 [32];
  undefined1 auVar228 [32];
  
  PVar4 = prim[1];
  uVar35 = (ulong)(byte)PVar4;
  fVar119 = *(float *)(prim + uVar35 * 0x19 + 0x12);
  auVar40 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar40 = vinsertps_avx(auVar40,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar48 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar41 = vinsertps_avx(auVar48,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar43 = vsubps_avx(auVar40,*(undefined1 (*) [16])(prim + uVar35 * 0x19 + 6));
  fVar118 = fVar119 * auVar43._0_4_;
  fVar101 = fVar119 * auVar41._0_4_;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + uVar35 * 4 + 6);
  auVar73 = vpmovsxbd_avx2(auVar40);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *(ulong *)(prim + uVar35 * 5 + 6);
  auVar71 = vpmovsxbd_avx2(auVar48);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar71 = vcvtdq2ps_avx(auVar71);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + uVar35 * 6 + 6);
  auVar74 = vpmovsxbd_avx2(auVar47);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + uVar35 * 0xb + 6);
  auVar84 = vpmovsxbd_avx2(auVar46);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6);
  auVar78 = vpmovsxbd_avx2(auVar49);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar85 = vcvtdq2ps_avx(auVar78);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *(ulong *)(prim + (uint)(byte)PVar4 * 0xc + uVar35 + 6);
  auVar72 = vpmovsxbd_avx2(auVar50);
  auVar72 = vcvtdq2ps_avx(auVar72);
  uVar34 = (ulong)(uint)((int)(uVar35 * 9) * 2);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(prim + uVar34 + 6);
  auVar75 = vpmovsxbd_avx2(auVar45);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + uVar34 + uVar35 + 6);
  auVar76 = vpmovsxbd_avx2(auVar44);
  auVar76 = vcvtdq2ps_avx(auVar76);
  uVar28 = (ulong)(uint)((int)(uVar35 * 5) << 2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar28 + 6);
  auVar70 = vpmovsxbd_avx2(auVar3);
  auVar77 = vcvtdq2ps_avx(auVar70);
  auVar141._4_4_ = fVar101;
  auVar141._0_4_ = fVar101;
  auVar141._8_4_ = fVar101;
  auVar141._12_4_ = fVar101;
  auVar141._16_4_ = fVar101;
  auVar141._20_4_ = fVar101;
  auVar141._24_4_ = fVar101;
  auVar141._28_4_ = fVar101;
  auVar234._8_4_ = 1;
  auVar234._0_8_ = 0x100000001;
  auVar234._12_4_ = 1;
  auVar234._16_4_ = 1;
  auVar234._20_4_ = 1;
  auVar234._24_4_ = 1;
  auVar234._28_4_ = 1;
  auVar68 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar242 = ZEXT3264(auVar68);
  auVar80 = ZEXT1632(CONCAT412(fVar119 * auVar41._12_4_,
                               CONCAT48(fVar119 * auVar41._8_4_,
                                        CONCAT44(fVar119 * auVar41._4_4_,fVar101))));
  auVar79 = vpermps_avx2(auVar234,auVar80);
  auVar69 = vpermps_avx512vl(auVar68,auVar80);
  fVar101 = auVar69._0_4_;
  fVar190 = auVar69._4_4_;
  auVar80._4_4_ = fVar190 * auVar74._4_4_;
  auVar80._0_4_ = fVar101 * auVar74._0_4_;
  fVar199 = auVar69._8_4_;
  auVar80._8_4_ = fVar199 * auVar74._8_4_;
  fVar200 = auVar69._12_4_;
  auVar80._12_4_ = fVar200 * auVar74._12_4_;
  fVar106 = auVar69._16_4_;
  auVar80._16_4_ = fVar106 * auVar74._16_4_;
  fVar107 = auVar69._20_4_;
  auVar80._20_4_ = fVar107 * auVar74._20_4_;
  fVar108 = auVar69._24_4_;
  auVar80._24_4_ = fVar108 * auVar74._24_4_;
  auVar80._28_4_ = auVar78._28_4_;
  auVar78._4_4_ = auVar72._4_4_ * fVar190;
  auVar78._0_4_ = auVar72._0_4_ * fVar101;
  auVar78._8_4_ = auVar72._8_4_ * fVar199;
  auVar78._12_4_ = auVar72._12_4_ * fVar200;
  auVar78._16_4_ = auVar72._16_4_ * fVar106;
  auVar78._20_4_ = auVar72._20_4_ * fVar107;
  auVar78._24_4_ = auVar72._24_4_ * fVar108;
  auVar78._28_4_ = auVar70._28_4_;
  auVar70._4_4_ = auVar77._4_4_ * fVar190;
  auVar70._0_4_ = auVar77._0_4_ * fVar101;
  auVar70._8_4_ = auVar77._8_4_ * fVar199;
  auVar70._12_4_ = auVar77._12_4_ * fVar200;
  auVar70._16_4_ = auVar77._16_4_ * fVar106;
  auVar70._20_4_ = auVar77._20_4_ * fVar107;
  auVar70._24_4_ = auVar77._24_4_ * fVar108;
  auVar70._28_4_ = auVar69._28_4_;
  auVar40 = vfmadd231ps_fma(auVar80,auVar79,auVar71);
  auVar48 = vfmadd231ps_fma(auVar78,auVar79,auVar85);
  auVar47 = vfmadd231ps_fma(auVar70,auVar76,auVar79);
  auVar40 = vfmadd231ps_fma(ZEXT1632(auVar40),auVar141,auVar73);
  auVar48 = vfmadd231ps_fma(ZEXT1632(auVar48),auVar141,auVar84);
  auVar47 = vfmadd231ps_fma(ZEXT1632(auVar47),auVar75,auVar141);
  auVar221._4_4_ = fVar118;
  auVar221._0_4_ = fVar118;
  auVar221._8_4_ = fVar118;
  auVar221._12_4_ = fVar118;
  auVar221._16_4_ = fVar118;
  auVar221._20_4_ = fVar118;
  auVar221._24_4_ = fVar118;
  auVar221._28_4_ = fVar118;
  auVar70 = ZEXT1632(CONCAT412(fVar119 * auVar43._12_4_,
                               CONCAT48(fVar119 * auVar43._8_4_,
                                        CONCAT44(fVar119 * auVar43._4_4_,fVar118))));
  auVar78 = vpermps_avx2(auVar234,auVar70);
  auVar70 = vpermps_avx512vl(auVar68,auVar70);
  fVar119 = auVar70._0_4_;
  fVar101 = auVar70._4_4_;
  auVar79._4_4_ = fVar101 * auVar74._4_4_;
  auVar79._0_4_ = fVar119 * auVar74._0_4_;
  fVar190 = auVar70._8_4_;
  auVar79._8_4_ = fVar190 * auVar74._8_4_;
  fVar199 = auVar70._12_4_;
  auVar79._12_4_ = fVar199 * auVar74._12_4_;
  fVar200 = auVar70._16_4_;
  auVar79._16_4_ = fVar200 * auVar74._16_4_;
  fVar106 = auVar70._20_4_;
  auVar79._20_4_ = fVar106 * auVar74._20_4_;
  fVar107 = auVar70._24_4_;
  auVar79._24_4_ = fVar107 * auVar74._24_4_;
  auVar79._28_4_ = 1;
  auVar68._4_4_ = auVar72._4_4_ * fVar101;
  auVar68._0_4_ = auVar72._0_4_ * fVar119;
  auVar68._8_4_ = auVar72._8_4_ * fVar190;
  auVar68._12_4_ = auVar72._12_4_ * fVar199;
  auVar68._16_4_ = auVar72._16_4_ * fVar200;
  auVar68._20_4_ = auVar72._20_4_ * fVar106;
  auVar68._24_4_ = auVar72._24_4_ * fVar107;
  auVar68._28_4_ = auVar74._28_4_;
  auVar72._4_4_ = auVar77._4_4_ * fVar101;
  auVar72._0_4_ = auVar77._0_4_ * fVar119;
  auVar72._8_4_ = auVar77._8_4_ * fVar190;
  auVar72._12_4_ = auVar77._12_4_ * fVar199;
  auVar72._16_4_ = auVar77._16_4_ * fVar200;
  auVar72._20_4_ = auVar77._20_4_ * fVar106;
  auVar72._24_4_ = auVar77._24_4_ * fVar107;
  auVar72._28_4_ = auVar70._28_4_;
  auVar46 = vfmadd231ps_fma(auVar79,auVar78,auVar71);
  auVar49 = vfmadd231ps_fma(auVar68,auVar78,auVar85);
  auVar50 = vfmadd231ps_fma(auVar72,auVar78,auVar76);
  auVar46 = vfmadd231ps_fma(ZEXT1632(auVar46),auVar221,auVar73);
  auVar49 = vfmadd231ps_fma(ZEXT1632(auVar49),auVar221,auVar84);
  auVar87._8_4_ = 0x7fffffff;
  auVar87._0_8_ = 0x7fffffff7fffffff;
  auVar87._12_4_ = 0x7fffffff;
  auVar87._16_4_ = 0x7fffffff;
  auVar87._20_4_ = 0x7fffffff;
  auVar87._24_4_ = 0x7fffffff;
  auVar87._28_4_ = 0x7fffffff;
  auVar50 = vfmadd231ps_fma(ZEXT1632(auVar50),auVar221,auVar75);
  auVar73 = vandps_avx(ZEXT1632(auVar40),auVar87);
  auVar130._8_4_ = 0x219392ef;
  auVar130._0_8_ = 0x219392ef219392ef;
  auVar130._12_4_ = 0x219392ef;
  auVar130._16_4_ = 0x219392ef;
  auVar130._20_4_ = 0x219392ef;
  auVar130._24_4_ = 0x219392ef;
  auVar130._28_4_ = 0x219392ef;
  uVar34 = vcmpps_avx512vl(auVar73,auVar130,1);
  bVar38 = (bool)((byte)uVar34 & 1);
  auVar69._0_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar40._0_4_;
  bVar38 = (bool)((byte)(uVar34 >> 1) & 1);
  auVar69._4_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar40._4_4_;
  bVar38 = (bool)((byte)(uVar34 >> 2) & 1);
  auVar69._8_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar40._8_4_;
  bVar38 = (bool)((byte)(uVar34 >> 3) & 1);
  auVar69._12_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar40._12_4_;
  auVar69._16_4_ = (uint)((byte)(uVar34 >> 4) & 1) * 0x219392ef;
  auVar69._20_4_ = (uint)((byte)(uVar34 >> 5) & 1) * 0x219392ef;
  auVar69._24_4_ = (uint)((byte)(uVar34 >> 6) & 1) * 0x219392ef;
  auVar69._28_4_ = (uint)(byte)(uVar34 >> 7) * 0x219392ef;
  auVar73 = vandps_avx(ZEXT1632(auVar48),auVar87);
  uVar34 = vcmpps_avx512vl(auVar73,auVar130,1);
  bVar38 = (bool)((byte)uVar34 & 1);
  auVar81._0_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar48._0_4_;
  bVar38 = (bool)((byte)(uVar34 >> 1) & 1);
  auVar81._4_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar48._4_4_;
  bVar38 = (bool)((byte)(uVar34 >> 2) & 1);
  auVar81._8_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar48._8_4_;
  bVar38 = (bool)((byte)(uVar34 >> 3) & 1);
  auVar81._12_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar48._12_4_;
  auVar81._16_4_ = (uint)((byte)(uVar34 >> 4) & 1) * 0x219392ef;
  auVar81._20_4_ = (uint)((byte)(uVar34 >> 5) & 1) * 0x219392ef;
  auVar81._24_4_ = (uint)((byte)(uVar34 >> 6) & 1) * 0x219392ef;
  auVar81._28_4_ = (uint)(byte)(uVar34 >> 7) * 0x219392ef;
  auVar73 = vandps_avx(ZEXT1632(auVar47),auVar87);
  uVar34 = vcmpps_avx512vl(auVar73,auVar130,1);
  bVar38 = (bool)((byte)uVar34 & 1);
  auVar73._0_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar47._0_4_;
  bVar38 = (bool)((byte)(uVar34 >> 1) & 1);
  auVar73._4_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar47._4_4_;
  bVar38 = (bool)((byte)(uVar34 >> 2) & 1);
  auVar73._8_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar47._8_4_;
  bVar38 = (bool)((byte)(uVar34 >> 3) & 1);
  auVar73._12_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar47._12_4_;
  auVar73._16_4_ = (uint)((byte)(uVar34 >> 4) & 1) * 0x219392ef;
  auVar73._20_4_ = (uint)((byte)(uVar34 >> 5) & 1) * 0x219392ef;
  auVar73._24_4_ = (uint)((byte)(uVar34 >> 6) & 1) * 0x219392ef;
  auVar73._28_4_ = (uint)(byte)(uVar34 >> 7) * 0x219392ef;
  auVar71 = vrcp14ps_avx512vl(auVar69);
  auVar88._8_4_ = 0x3f800000;
  auVar88._0_8_ = 0x3f8000003f800000;
  auVar88._12_4_ = 0x3f800000;
  auVar88._16_4_ = 0x3f800000;
  auVar88._20_4_ = 0x3f800000;
  auVar88._24_4_ = 0x3f800000;
  auVar88._28_4_ = 0x3f800000;
  auVar40 = vfnmadd213ps_fma(auVar69,auVar71,auVar88);
  auVar40 = vfmadd132ps_fma(ZEXT1632(auVar40),auVar71,auVar71);
  auVar71 = vrcp14ps_avx512vl(auVar81);
  auVar48 = vfnmadd213ps_fma(auVar81,auVar71,auVar88);
  auVar48 = vfmadd132ps_fma(ZEXT1632(auVar48),auVar71,auVar71);
  auVar71 = vrcp14ps_avx512vl(auVar73);
  auVar47 = vfnmadd213ps_fma(auVar73,auVar71,auVar88);
  auVar47 = vfmadd132ps_fma(ZEXT1632(auVar47),auVar71,auVar71);
  auVar73 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar35 * 7 + 6));
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx(auVar73,ZEXT1632(auVar46));
  auVar75._4_4_ = auVar40._4_4_ * auVar73._4_4_;
  auVar75._0_4_ = auVar40._0_4_ * auVar73._0_4_;
  auVar75._8_4_ = auVar40._8_4_ * auVar73._8_4_;
  auVar75._12_4_ = auVar40._12_4_ * auVar73._12_4_;
  auVar75._16_4_ = auVar73._16_4_ * 0.0;
  auVar75._20_4_ = auVar73._20_4_ * 0.0;
  auVar75._24_4_ = auVar73._24_4_ * 0.0;
  auVar75._28_4_ = auVar73._28_4_;
  auVar73 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar35 * 9 + 6));
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx(auVar73,ZEXT1632(auVar46));
  auVar72 = vpbroadcastd_avx512vl();
  auVar71 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar4 * 0x10 + 6));
  auVar86._0_4_ = auVar40._0_4_ * auVar73._0_4_;
  auVar86._4_4_ = auVar40._4_4_ * auVar73._4_4_;
  auVar86._8_4_ = auVar40._8_4_ * auVar73._8_4_;
  auVar86._12_4_ = auVar40._12_4_ * auVar73._12_4_;
  auVar86._16_4_ = auVar73._16_4_ * 0.0;
  auVar86._20_4_ = auVar73._20_4_ * 0.0;
  auVar86._24_4_ = auVar73._24_4_ * 0.0;
  auVar86._28_4_ = 0;
  auVar73 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar4 * 0x10 + uVar35 * -2 + 6));
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx(auVar73,ZEXT1632(auVar49));
  auVar76._4_4_ = auVar48._4_4_ * auVar73._4_4_;
  auVar76._0_4_ = auVar48._0_4_ * auVar73._0_4_;
  auVar76._8_4_ = auVar48._8_4_ * auVar73._8_4_;
  auVar76._12_4_ = auVar48._12_4_ * auVar73._12_4_;
  auVar76._16_4_ = auVar73._16_4_ * 0.0;
  auVar76._20_4_ = auVar73._20_4_ * 0.0;
  auVar76._24_4_ = auVar73._24_4_ * 0.0;
  auVar76._28_4_ = auVar73._28_4_;
  auVar73 = vcvtdq2ps_avx(auVar71);
  auVar73 = vsubps_avx(auVar73,ZEXT1632(auVar49));
  auVar83._0_4_ = auVar48._0_4_ * auVar73._0_4_;
  auVar83._4_4_ = auVar48._4_4_ * auVar73._4_4_;
  auVar83._8_4_ = auVar48._8_4_ * auVar73._8_4_;
  auVar83._12_4_ = auVar48._12_4_ * auVar73._12_4_;
  auVar83._16_4_ = auVar73._16_4_ * 0.0;
  auVar83._20_4_ = auVar73._20_4_ * 0.0;
  auVar83._24_4_ = auVar73._24_4_ * 0.0;
  auVar83._28_4_ = 0;
  auVar73 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 + uVar35 + 6));
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx(auVar73,ZEXT1632(auVar50));
  auVar77._4_4_ = auVar73._4_4_ * auVar47._4_4_;
  auVar77._0_4_ = auVar73._0_4_ * auVar47._0_4_;
  auVar77._8_4_ = auVar73._8_4_ * auVar47._8_4_;
  auVar77._12_4_ = auVar73._12_4_ * auVar47._12_4_;
  auVar77._16_4_ = auVar73._16_4_ * 0.0;
  auVar77._20_4_ = auVar73._20_4_ * 0.0;
  auVar77._24_4_ = auVar73._24_4_ * 0.0;
  auVar77._28_4_ = auVar73._28_4_;
  auVar73 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar35 * 0x17 + 6));
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx(auVar73,ZEXT1632(auVar50));
  auVar82._0_4_ = auVar47._0_4_ * auVar73._0_4_;
  auVar82._4_4_ = auVar47._4_4_ * auVar73._4_4_;
  auVar82._8_4_ = auVar47._8_4_ * auVar73._8_4_;
  auVar82._12_4_ = auVar47._12_4_ * auVar73._12_4_;
  auVar82._16_4_ = auVar73._16_4_ * 0.0;
  auVar82._20_4_ = auVar73._20_4_ * 0.0;
  auVar82._24_4_ = auVar73._24_4_ * 0.0;
  auVar82._28_4_ = 0;
  auVar73 = vpminsd_avx2(auVar75,auVar86);
  auVar71 = vpminsd_avx2(auVar76,auVar83);
  auVar73 = vmaxps_avx(auVar73,auVar71);
  auVar71 = vpminsd_avx2(auVar77,auVar82);
  uVar109 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar74._4_4_ = uVar109;
  auVar74._0_4_ = uVar109;
  auVar74._8_4_ = uVar109;
  auVar74._12_4_ = uVar109;
  auVar74._16_4_ = uVar109;
  auVar74._20_4_ = uVar109;
  auVar74._24_4_ = uVar109;
  auVar74._28_4_ = uVar109;
  auVar71 = vmaxps_avx512vl(auVar71,auVar74);
  auVar73 = vmaxps_avx(auVar73,auVar71);
  auVar71._8_4_ = 0x3f7ffffa;
  auVar71._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar71._12_4_ = 0x3f7ffffa;
  auVar71._16_4_ = 0x3f7ffffa;
  auVar71._20_4_ = 0x3f7ffffa;
  auVar71._24_4_ = 0x3f7ffffa;
  auVar71._28_4_ = 0x3f7ffffa;
  local_78 = vmulps_avx512vl(auVar73,auVar71);
  auVar73 = vpmaxsd_avx2(auVar75,auVar86);
  auVar71 = vpmaxsd_avx2(auVar76,auVar83);
  auVar73 = vminps_avx(auVar73,auVar71);
  auVar71 = vpmaxsd_avx2(auVar77,auVar82);
  uVar109 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar84._4_4_ = uVar109;
  auVar84._0_4_ = uVar109;
  auVar84._8_4_ = uVar109;
  auVar84._12_4_ = uVar109;
  auVar84._16_4_ = uVar109;
  auVar84._20_4_ = uVar109;
  auVar84._24_4_ = uVar109;
  auVar84._28_4_ = uVar109;
  auVar71 = vminps_avx512vl(auVar71,auVar84);
  auVar73 = vminps_avx(auVar73,auVar71);
  auVar85._8_4_ = 0x3f800003;
  auVar85._0_8_ = 0x3f8000033f800003;
  auVar85._12_4_ = 0x3f800003;
  auVar85._16_4_ = 0x3f800003;
  auVar85._20_4_ = 0x3f800003;
  auVar85._24_4_ = 0x3f800003;
  auVar85._28_4_ = 0x3f800003;
  auVar73 = vmulps_avx512vl(auVar73,auVar85);
  uVar12 = vpcmpgtd_avx512vl(auVar72,_DAT_01fe9900);
  uVar11 = vcmpps_avx512vl(local_78,auVar73,2);
  if ((byte)((byte)uVar11 & (byte)uVar12) != 0) {
    uVar34 = (ulong)(byte)((byte)uVar11 & (byte)uVar12);
    local_308 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    auVar40 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar235 = ZEXT1664(auVar40);
    auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar236 = ZEXT1664(auVar40);
    auVar40 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar237 = ZEXT1664(auVar40);
    auVar244 = ZEXT464(0x3f800000);
    auVar40 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
    auVar243 = ZEXT1664(auVar40);
    do {
      lVar30 = 0;
      for (uVar28 = uVar34; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
        lVar30 = lVar30 + 1;
      }
      uVar33 = *(uint *)(prim + 2);
      uVar5 = *(uint *)(prim + lVar30 * 4 + 6);
      pGVar7 = (context->scene->geometries).items[uVar33].ptr;
      uVar28 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                               pGVar7[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i * (ulong)uVar5);
      p_Var8 = pGVar7[1].intersectionFilterN;
      pvVar9 = pGVar7[2].userPtr;
      _Var10 = pGVar7[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar40 = *(undefined1 (*) [16])(_Var10 + uVar28 * (long)pvVar9);
      auVar48 = *(undefined1 (*) [16])(_Var10 + (uVar28 + 1) * (long)pvVar9);
      auVar47 = *(undefined1 (*) [16])(_Var10 + (uVar28 + 2) * (long)pvVar9);
      auVar46 = *(undefined1 (*) [16])(_Var10 + (long)pvVar9 * (uVar28 + 3));
      lVar30 = *(long *)&pGVar7[1].time_range.upper;
      auVar49 = *(undefined1 (*) [16])(lVar30 + (long)p_Var8 * uVar28);
      auVar50 = *(undefined1 (*) [16])(lVar30 + (long)p_Var8 * (uVar28 + 1));
      auVar45 = *(undefined1 (*) [16])(lVar30 + (long)p_Var8 * (uVar28 + 2));
      uVar34 = uVar34 - 1 & uVar34;
      auVar44 = *(undefined1 (*) [16])(lVar30 + (long)p_Var8 * (uVar28 + 3));
      if (uVar34 != 0) {
        uVar35 = uVar34 - 1 & uVar34;
        for (uVar28 = uVar34; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
        }
        if (uVar35 != 0) {
          for (; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000) {
          }
        }
      }
      auVar3 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                             0x1c);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      fVar119 = *(float *)(ray + k * 4 + 0x30);
      auVar110 = ZEXT816(0) << 0x40;
      auVar43._0_4_ = auVar44._0_4_ * 0.0;
      auVar43._4_4_ = auVar44._4_4_ * 0.0;
      auVar43._8_4_ = auVar44._8_4_ * 0.0;
      auVar43._12_4_ = auVar44._12_4_ * 0.0;
      auVar43 = vfmadd231ps_fma(auVar43,auVar45,auVar110);
      auVar41 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar50,auVar43);
      auVar51._0_4_ = auVar49._0_4_ + auVar41._0_4_;
      auVar51._4_4_ = auVar49._4_4_ + auVar41._4_4_;
      auVar51._8_4_ = auVar49._8_4_ + auVar41._8_4_;
      auVar51._12_4_ = auVar49._12_4_ + auVar41._12_4_;
      auVar54 = auVar235._0_16_;
      auVar41 = vfmadd231ps_avx512vl(auVar43,auVar50,auVar54);
      auVar42 = vfnmadd231ps_avx512vl(auVar41,auVar49,auVar54);
      auVar202._0_4_ = auVar46._0_4_ * 0.0;
      auVar202._4_4_ = auVar46._4_4_ * 0.0;
      auVar202._8_4_ = auVar46._8_4_ * 0.0;
      auVar202._12_4_ = auVar46._12_4_ * 0.0;
      auVar43 = vfmadd231ps_fma(auVar202,auVar47,auVar110);
      auVar41 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar48,auVar43);
      auVar215._0_4_ = auVar40._0_4_ + auVar41._0_4_;
      auVar215._4_4_ = auVar40._4_4_ + auVar41._4_4_;
      auVar215._8_4_ = auVar40._8_4_ + auVar41._8_4_;
      auVar215._12_4_ = auVar40._12_4_ + auVar41._12_4_;
      auVar41 = vfmadd231ps_avx512vl(auVar43,auVar48,auVar54);
      auVar43 = vfnmadd231ps_avx512vl(auVar41,auVar40,auVar54);
      auVar41 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar45,auVar44);
      auVar41 = vfmadd231ps_fma(auVar41,auVar50,auVar110);
      auVar41 = vfmadd231ps_fma(auVar41,auVar49,auVar110);
      auVar44 = vmulps_avx512vl(auVar44,auVar54);
      auVar45 = vfnmadd231ps_avx512vl(auVar44,auVar54,auVar45);
      auVar50 = vfmadd231ps_fma(auVar45,auVar110,auVar50);
      auVar45 = vfnmadd231ps_fma(auVar50,auVar110,auVar49);
      auVar49 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar47,auVar46);
      auVar49 = vfmadd231ps_fma(auVar49,auVar48,auVar110);
      auVar49 = vfmadd231ps_fma(auVar49,auVar40,auVar110);
      auVar46 = vmulps_avx512vl(auVar46,auVar54);
      auVar47 = vfnmadd231ps_avx512vl(auVar46,auVar54,auVar47);
      auVar48 = vfmadd231ps_fma(auVar47,auVar110,auVar48);
      auVar50 = vfnmadd231ps_fma(auVar48,auVar110,auVar40);
      auVar40 = vshufps_avx(auVar42,auVar42,0xc9);
      auVar48 = vshufps_avx(auVar215,auVar215,0xc9);
      fVar106 = auVar42._0_4_;
      auVar144._0_4_ = fVar106 * auVar48._0_4_;
      fVar107 = auVar42._4_4_;
      auVar144._4_4_ = fVar107 * auVar48._4_4_;
      fVar108 = auVar42._8_4_;
      auVar144._8_4_ = fVar108 * auVar48._8_4_;
      fVar118 = auVar42._12_4_;
      auVar144._12_4_ = fVar118 * auVar48._12_4_;
      auVar48 = vfmsub231ps_fma(auVar144,auVar40,auVar215);
      auVar47 = vshufps_avx(auVar48,auVar48,0xc9);
      auVar48 = vshufps_avx(auVar43,auVar43,0xc9);
      auVar55._0_4_ = fVar106 * auVar48._0_4_;
      auVar55._4_4_ = fVar107 * auVar48._4_4_;
      auVar55._8_4_ = fVar108 * auVar48._8_4_;
      auVar55._12_4_ = fVar118 * auVar48._12_4_;
      auVar40 = vfmsub231ps_fma(auVar55,auVar40,auVar43);
      auVar46 = vshufps_avx(auVar40,auVar40,0xc9);
      auVar40 = vshufps_avx(auVar45,auVar45,0xc9);
      auVar48 = vshufps_avx(auVar49,auVar49,0xc9);
      fVar125 = auVar45._0_4_;
      auVar59._0_4_ = fVar125 * auVar48._0_4_;
      fVar132 = auVar45._4_4_;
      auVar59._4_4_ = fVar132 * auVar48._4_4_;
      fVar133 = auVar45._8_4_;
      auVar59._8_4_ = fVar133 * auVar48._8_4_;
      fVar134 = auVar45._12_4_;
      auVar59._12_4_ = fVar134 * auVar48._12_4_;
      auVar48 = vfmsub231ps_fma(auVar59,auVar40,auVar49);
      auVar49 = vshufps_avx(auVar48,auVar48,0xc9);
      auVar48 = vshufps_avx(auVar50,auVar50,0xc9);
      auVar169._0_4_ = auVar48._0_4_ * fVar125;
      auVar169._4_4_ = auVar48._4_4_ * fVar132;
      auVar169._8_4_ = auVar48._8_4_ * fVar133;
      auVar169._12_4_ = auVar48._12_4_ * fVar134;
      auVar48 = vfmsub231ps_fma(auVar169,auVar40,auVar50);
      auVar40 = vdpps_avx(auVar47,auVar47,0x7f);
      auVar50 = vshufps_avx(auVar48,auVar48,0xc9);
      fVar101 = auVar40._0_4_;
      auVar170._4_12_ = ZEXT812(0) << 0x20;
      auVar170._0_4_ = fVar101;
      auVar48 = vrsqrt14ss_avx512f(auVar110,auVar170);
      auVar44 = vmulss_avx512f(auVar48,ZEXT416(0x3fc00000));
      auVar43 = vmulss_avx512f(auVar40,ZEXT416(0x3f000000));
      fVar190 = auVar48._0_4_;
      auVar48 = vdpps_avx(auVar47,auVar46,0x7f);
      fVar199 = auVar44._0_4_ - auVar43._0_4_ * fVar190 * fVar190 * fVar190;
      fVar201 = fVar199 * auVar47._0_4_;
      fVar211 = fVar199 * auVar47._4_4_;
      fVar212 = fVar199 * auVar47._8_4_;
      fVar213 = fVar199 * auVar47._12_4_;
      auVar181._0_4_ = auVar46._0_4_ * fVar101;
      auVar181._4_4_ = auVar46._4_4_ * fVar101;
      auVar181._8_4_ = auVar46._8_4_ * fVar101;
      auVar181._12_4_ = auVar46._12_4_ * fVar101;
      fVar101 = auVar48._0_4_;
      auVar152._0_4_ = fVar101 * auVar47._0_4_;
      auVar152._4_4_ = fVar101 * auVar47._4_4_;
      auVar152._8_4_ = fVar101 * auVar47._8_4_;
      auVar152._12_4_ = fVar101 * auVar47._12_4_;
      auVar47 = vsubps_avx(auVar181,auVar152);
      auVar48 = vrcp14ss_avx512f(auVar110,auVar170);
      auVar40 = vfnmadd213ss_avx512f(auVar40,auVar48,ZEXT416(0x40000000));
      fVar101 = auVar48._0_4_ * auVar40._0_4_;
      auVar40 = vdpps_avx(auVar49,auVar49,0x7f);
      fVar190 = auVar40._0_4_;
      auVar171._4_12_ = ZEXT812(0) << 0x20;
      auVar171._0_4_ = fVar190;
      auVar48 = vrsqrt14ss_avx512f(auVar110,auVar171);
      auVar46 = vmulss_avx512f(auVar48,ZEXT416(0x3fc00000));
      auVar44 = vmulss_avx512f(auVar40,ZEXT416(0x3f000000));
      fVar200 = auVar48._0_4_;
      fVar200 = auVar46._0_4_ - auVar44._0_4_ * fVar200 * fVar200 * fVar200;
      auVar48 = vdpps_avx(auVar49,auVar50,0x7f);
      fVar214 = fVar200 * auVar49._0_4_;
      fVar222 = fVar200 * auVar49._4_4_;
      fVar223 = fVar200 * auVar49._8_4_;
      fVar224 = fVar200 * auVar49._12_4_;
      auVar56._0_4_ = fVar190 * auVar50._0_4_;
      auVar56._4_4_ = fVar190 * auVar50._4_4_;
      auVar56._8_4_ = fVar190 * auVar50._8_4_;
      auVar56._12_4_ = fVar190 * auVar50._12_4_;
      fVar190 = auVar48._0_4_;
      auVar60._0_4_ = fVar190 * auVar49._0_4_;
      auVar60._4_4_ = fVar190 * auVar49._4_4_;
      auVar60._8_4_ = fVar190 * auVar49._8_4_;
      auVar60._12_4_ = fVar190 * auVar49._12_4_;
      auVar46 = vsubps_avx(auVar56,auVar60);
      auVar48 = vrcp14ss_avx512f(auVar110,auVar171);
      auVar40 = vfnmadd213ss_avx512f(auVar40,auVar48,ZEXT416(0x40000000));
      fVar190 = auVar40._0_4_ * auVar48._0_4_;
      auVar40 = vshufps_avx(auVar51,auVar51,0xff);
      auVar159._0_4_ = fVar201 * auVar40._0_4_;
      auVar159._4_4_ = fVar211 * auVar40._4_4_;
      auVar159._8_4_ = fVar212 * auVar40._8_4_;
      auVar159._12_4_ = fVar213 * auVar40._12_4_;
      local_228 = vsubps_avx(auVar51,auVar159);
      auVar48 = vshufps_avx(auVar42,auVar42,0xff);
      auVar64._0_4_ = auVar48._0_4_ * fVar201 + auVar40._0_4_ * fVar199 * fVar101 * auVar47._0_4_;
      auVar64._4_4_ = auVar48._4_4_ * fVar211 + auVar40._4_4_ * fVar199 * fVar101 * auVar47._4_4_;
      auVar64._8_4_ = auVar48._8_4_ * fVar212 + auVar40._8_4_ * fVar199 * fVar101 * auVar47._8_4_;
      auVar64._12_4_ =
           auVar48._12_4_ * fVar213 + auVar40._12_4_ * fVar199 * fVar101 * auVar47._12_4_;
      auVar47 = vsubps_avx(auVar42,auVar64);
      local_238._0_4_ = auVar159._0_4_ + auVar51._0_4_;
      local_238._4_4_ = auVar159._4_4_ + auVar51._4_4_;
      fStack_230 = auVar159._8_4_ + auVar51._8_4_;
      fStack_22c = auVar159._12_4_ + auVar51._12_4_;
      auVar40 = vshufps_avx(auVar41,auVar41,0xff);
      auVar65._0_4_ = fVar214 * auVar40._0_4_;
      auVar65._4_4_ = fVar222 * auVar40._4_4_;
      auVar65._8_4_ = fVar223 * auVar40._8_4_;
      auVar65._12_4_ = fVar224 * auVar40._12_4_;
      local_248 = vsubps_avx512vl(auVar41,auVar65);
      auVar48 = vshufps_avx(auVar45,auVar45,0xff);
      auVar52._0_4_ = auVar48._0_4_ * fVar214 + auVar40._0_4_ * fVar200 * auVar46._0_4_ * fVar190;
      auVar52._4_4_ = auVar48._4_4_ * fVar222 + auVar40._4_4_ * fVar200 * auVar46._4_4_ * fVar190;
      auVar52._8_4_ = auVar48._8_4_ * fVar223 + auVar40._8_4_ * fVar200 * auVar46._8_4_ * fVar190;
      auVar52._12_4_ =
           auVar48._12_4_ * fVar224 + auVar40._12_4_ * fVar200 * auVar46._12_4_ * fVar190;
      auVar40 = vsubps_avx(auVar45,auVar52);
      local_258._0_4_ = auVar41._0_4_ + auVar65._0_4_;
      local_258._4_4_ = auVar41._4_4_ + auVar65._4_4_;
      fStack_250 = auVar41._8_4_ + auVar65._8_4_;
      fStack_24c = auVar41._12_4_ + auVar65._12_4_;
      auVar63._0_4_ = auVar47._0_4_ * 0.33333334;
      auVar63._4_4_ = auVar47._4_4_ * 0.33333334;
      auVar63._8_4_ = auVar47._8_4_ * 0.33333334;
      auVar63._12_4_ = auVar47._12_4_ * 0.33333334;
      local_268 = vaddps_avx512vl(local_228,auVar63);
      auVar57._0_4_ = auVar40._0_4_ * 0.33333334;
      auVar57._4_4_ = auVar40._4_4_ * 0.33333334;
      auVar57._8_4_ = auVar40._8_4_ * 0.33333334;
      auVar57._12_4_ = auVar40._12_4_ * 0.33333334;
      local_278 = vsubps_avx512vl(local_248,auVar57);
      auVar42._0_4_ = (fVar106 + auVar64._0_4_) * 0.33333334;
      auVar42._4_4_ = (fVar107 + auVar64._4_4_) * 0.33333334;
      auVar42._8_4_ = (fVar108 + auVar64._8_4_) * 0.33333334;
      auVar42._12_4_ = (fVar118 + auVar64._12_4_) * 0.33333334;
      _local_288 = vaddps_avx512vl(_local_238,auVar42);
      auVar110._0_4_ = (fVar125 + auVar52._0_4_) * 0.33333334;
      auVar110._4_4_ = (fVar132 + auVar52._4_4_) * 0.33333334;
      auVar110._8_4_ = (fVar133 + auVar52._8_4_) * 0.33333334;
      auVar110._12_4_ = (fVar134 + auVar52._12_4_) * 0.33333334;
      _local_298 = vsubps_avx512vl(_local_258,auVar110);
      local_1a8 = vsubps_avx(local_228,auVar3);
      uVar109 = local_1a8._0_4_;
      auVar53._4_4_ = uVar109;
      auVar53._0_4_ = uVar109;
      auVar53._8_4_ = uVar109;
      auVar53._12_4_ = uVar109;
      auVar40 = vshufps_avx(local_1a8,local_1a8,0x55);
      aVar1 = pre->ray_space[k].vx.field_0;
      aVar2 = pre->ray_space[k].vy.field_0;
      auVar48 = vshufps_avx(local_1a8,local_1a8,0xaa);
      fVar101 = pre->ray_space[k].vz.field_0.m128[0];
      fVar190 = pre->ray_space[k].vz.field_0.m128[1];
      fVar199 = pre->ray_space[k].vz.field_0.m128[2];
      fVar200 = pre->ray_space[k].vz.field_0.m128[3];
      auVar67._0_4_ = fVar101 * auVar48._0_4_;
      auVar67._4_4_ = fVar190 * auVar48._4_4_;
      auVar67._8_4_ = fVar199 * auVar48._8_4_;
      auVar67._12_4_ = fVar200 * auVar48._12_4_;
      auVar40 = vfmadd231ps_fma(auVar67,(undefined1  [16])aVar2,auVar40);
      auVar50 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar1,auVar53);
      local_1b8 = vsubps_avx512vl(local_268,auVar3);
      uVar109 = local_1b8._0_4_;
      auVar58._4_4_ = uVar109;
      auVar58._0_4_ = uVar109;
      auVar58._8_4_ = uVar109;
      auVar58._12_4_ = uVar109;
      auVar40 = vshufps_avx(local_1b8,local_1b8,0x55);
      auVar48 = vshufps_avx(local_1b8,local_1b8,0xaa);
      auVar62._0_4_ = fVar101 * auVar48._0_4_;
      auVar62._4_4_ = fVar190 * auVar48._4_4_;
      auVar62._8_4_ = fVar199 * auVar48._8_4_;
      auVar62._12_4_ = fVar200 * auVar48._12_4_;
      auVar40 = vfmadd231ps_fma(auVar62,(undefined1  [16])aVar2,auVar40);
      auVar45 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar1,auVar58);
      local_1c8 = vsubps_avx512vl(local_278,auVar3);
      uVar109 = local_1c8._0_4_;
      auVar66._4_4_ = uVar109;
      auVar66._0_4_ = uVar109;
      auVar66._8_4_ = uVar109;
      auVar66._12_4_ = uVar109;
      auVar40 = vshufps_avx(local_1c8,local_1c8,0x55);
      auVar48 = vshufps_avx(local_1c8,local_1c8,0xaa);
      auVar61._0_4_ = fVar101 * auVar48._0_4_;
      auVar61._4_4_ = fVar190 * auVar48._4_4_;
      auVar61._8_4_ = fVar199 * auVar48._8_4_;
      auVar61._12_4_ = fVar200 * auVar48._12_4_;
      auVar40 = vfmadd231ps_fma(auVar61,(undefined1  [16])aVar2,auVar40);
      auVar44 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar1,auVar66);
      local_1d8 = vsubps_avx512vl(local_248,auVar3);
      uVar109 = local_1d8._0_4_;
      auVar160._4_4_ = uVar109;
      auVar160._0_4_ = uVar109;
      auVar160._8_4_ = uVar109;
      auVar160._12_4_ = uVar109;
      auVar40 = vshufps_avx(local_1d8,local_1d8,0x55);
      auVar48 = vshufps_avx(local_1d8,local_1d8,0xaa);
      auVar145._0_4_ = fVar101 * auVar48._0_4_;
      auVar145._4_4_ = fVar190 * auVar48._4_4_;
      auVar145._8_4_ = fVar199 * auVar48._8_4_;
      auVar145._12_4_ = fVar200 * auVar48._12_4_;
      auVar40 = vfmadd231ps_fma(auVar145,(undefined1  [16])aVar2,auVar40);
      auVar41 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar1,auVar160);
      local_1e8 = vsubps_avx(_local_238,auVar3);
      uVar109 = local_1e8._0_4_;
      auVar161._4_4_ = uVar109;
      auVar161._0_4_ = uVar109;
      auVar161._8_4_ = uVar109;
      auVar161._12_4_ = uVar109;
      auVar40 = vshufps_avx(local_1e8,local_1e8,0x55);
      auVar48 = vshufps_avx(local_1e8,local_1e8,0xaa);
      auVar182._0_4_ = auVar48._0_4_ * fVar101;
      auVar182._4_4_ = auVar48._4_4_ * fVar190;
      auVar182._8_4_ = auVar48._8_4_ * fVar199;
      auVar182._12_4_ = auVar48._12_4_ * fVar200;
      auVar40 = vfmadd231ps_fma(auVar182,(undefined1  [16])aVar2,auVar40);
      auVar43 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar1,auVar161);
      local_1f8 = vsubps_avx512vl(_local_288,auVar3);
      uVar109 = local_1f8._0_4_;
      auVar162._4_4_ = uVar109;
      auVar162._0_4_ = uVar109;
      auVar162._8_4_ = uVar109;
      auVar162._12_4_ = uVar109;
      auVar40 = vshufps_avx(local_1f8,local_1f8,0x55);
      auVar48 = vshufps_avx(local_1f8,local_1f8,0xaa);
      auVar191._0_4_ = auVar48._0_4_ * fVar101;
      auVar191._4_4_ = auVar48._4_4_ * fVar190;
      auVar191._8_4_ = auVar48._8_4_ * fVar199;
      auVar191._12_4_ = auVar48._12_4_ * fVar200;
      auVar40 = vfmadd231ps_fma(auVar191,(undefined1  [16])aVar2,auVar40);
      auVar42 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar1,auVar162);
      local_208 = vsubps_avx512vl(_local_298,auVar3);
      uVar109 = local_208._0_4_;
      auVar163._4_4_ = uVar109;
      auVar163._0_4_ = uVar109;
      auVar163._8_4_ = uVar109;
      auVar163._12_4_ = uVar109;
      auVar40 = vshufps_avx(local_208,local_208,0x55);
      auVar48 = vshufps_avx(local_208,local_208,0xaa);
      auVar203._0_4_ = auVar48._0_4_ * fVar101;
      auVar203._4_4_ = auVar48._4_4_ * fVar190;
      auVar203._8_4_ = auVar48._8_4_ * fVar199;
      auVar203._12_4_ = auVar48._12_4_ * fVar200;
      auVar40 = vfmadd231ps_fma(auVar203,(undefined1  [16])aVar2,auVar40);
      auVar110 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar1,auVar163);
      local_218 = vsubps_avx(_local_258,auVar3);
      uVar109 = local_218._0_4_;
      auVar54._4_4_ = uVar109;
      auVar54._0_4_ = uVar109;
      auVar54._8_4_ = uVar109;
      auVar54._12_4_ = uVar109;
      auVar40 = vshufps_avx(local_218,local_218,0x55);
      auVar48 = vshufps_avx(local_218,local_218,0xaa);
      auVar153._0_4_ = auVar48._0_4_ * fVar101;
      auVar153._4_4_ = auVar48._4_4_ * fVar190;
      auVar153._8_4_ = auVar48._8_4_ * fVar199;
      auVar153._12_4_ = auVar48._12_4_ * fVar200;
      auVar40 = vfmadd231ps_fma(auVar153,(undefined1  [16])aVar2,auVar40);
      auVar3 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar1,auVar54);
      auVar47 = vmovlhps_avx(auVar50,auVar43);
      auVar46 = vmovlhps_avx(auVar45,auVar42);
      local_328 = vmovlhps_avx512f(auVar44,auVar110);
      _local_178 = vmovlhps_avx512f(auVar41,auVar3);
      auVar48 = vminps_avx(auVar47,auVar46);
      auVar40 = vmaxps_avx(auVar47,auVar46);
      auVar49 = vminps_avx512vl(local_328,_local_178);
      auVar48 = vminps_avx(auVar48,auVar49);
      auVar49 = vmaxps_avx512vl(local_328,_local_178);
      auVar40 = vmaxps_avx(auVar40,auVar49);
      auVar49 = vshufpd_avx(auVar48,auVar48,3);
      auVar48 = vminps_avx(auVar48,auVar49);
      auVar49 = vshufpd_avx(auVar40,auVar40,3);
      auVar40 = vmaxps_avx(auVar40,auVar49);
      auVar48 = vandps_avx512vl(auVar48,auVar236._0_16_);
      auVar40 = vandps_avx512vl(auVar40,auVar236._0_16_);
      auVar40 = vmaxps_avx(auVar48,auVar40);
      auVar48 = vmovshdup_avx(auVar40);
      auVar40 = vmaxss_avx(auVar48,auVar40);
      auVar49 = vmovddup_avx512vl(auVar50);
      auVar50 = vmovddup_avx512vl(auVar45);
      auVar45 = vmovddup_avx512vl(auVar44);
      auVar111._8_8_ = auVar41._0_8_;
      auVar111._0_8_ = auVar41._0_8_;
      local_188 = ZEXT416((uint)(auVar40._0_4_ * 9.536743e-07));
      local_148 = vbroadcastss_avx512vl(local_188);
      auVar40 = vxorps_avx512vl(local_148._0_16_,auVar237._0_16_);
      local_168 = vbroadcastss_avx512vl(auVar40);
      uVar28 = 0;
      auVar40 = vsubps_avx(auVar46,auVar47);
      auVar44 = vsubps_avx512vl(local_328,auVar46);
      local_198 = vsubps_avx512vl(_local_178,local_328);
      local_2a8 = vsubps_avx(_local_238,local_228);
      local_2b8 = vsubps_avx512vl(_local_288,local_268);
      local_2c8 = vsubps_avx512vl(_local_298,local_278);
      _local_2d8 = vsubps_avx512vl(_local_258,local_248);
      local_2e8 = vpbroadcastd_avx512vl();
      local_2f8 = vpbroadcastd_avx512vl();
      auVar48 = ZEXT816(0x3f80000000000000);
      auVar41 = auVar48;
LAB_01c92d73:
      auVar54 = vshufps_avx(auVar41,auVar41,0x50);
      auVar225._8_4_ = 0x3f800000;
      auVar225._0_8_ = 0x3f8000003f800000;
      auVar225._12_4_ = 0x3f800000;
      auVar228._16_4_ = 0x3f800000;
      auVar228._0_16_ = auVar225;
      auVar228._20_4_ = 0x3f800000;
      auVar228._24_4_ = 0x3f800000;
      auVar228._28_4_ = 0x3f800000;
      auVar67 = vsubps_avx(auVar225,auVar54);
      fVar101 = auVar54._0_4_;
      fVar106 = auVar43._0_4_;
      auVar126._0_4_ = fVar106 * fVar101;
      fVar190 = auVar54._4_4_;
      fVar107 = auVar43._4_4_;
      auVar126._4_4_ = fVar107 * fVar190;
      fVar199 = auVar54._8_4_;
      auVar126._8_4_ = fVar106 * fVar199;
      fVar200 = auVar54._12_4_;
      auVar126._12_4_ = fVar107 * fVar200;
      fVar108 = auVar42._0_4_;
      auVar135._0_4_ = fVar108 * fVar101;
      fVar118 = auVar42._4_4_;
      auVar135._4_4_ = fVar118 * fVar190;
      auVar135._8_4_ = fVar108 * fVar199;
      auVar135._12_4_ = fVar118 * fVar200;
      fVar125 = auVar110._0_4_;
      auVar146._0_4_ = fVar125 * fVar101;
      fVar132 = auVar110._4_4_;
      auVar146._4_4_ = fVar132 * fVar190;
      auVar146._8_4_ = fVar125 * fVar199;
      auVar146._12_4_ = fVar132 * fVar200;
      fVar133 = auVar3._0_4_;
      auVar113._0_4_ = fVar133 * fVar101;
      fVar134 = auVar3._4_4_;
      auVar113._4_4_ = fVar134 * fVar190;
      auVar113._8_4_ = fVar133 * fVar199;
      auVar113._12_4_ = fVar134 * fVar200;
      auVar51 = vfmadd231ps_avx512vl(auVar126,auVar67,auVar49);
      auVar52 = vfmadd231ps_avx512vl(auVar135,auVar67,auVar50);
      auVar53 = vfmadd231ps_avx512vl(auVar146,auVar67,auVar45);
      auVar67 = vfmadd231ps_fma(auVar113,auVar111,auVar67);
      auVar54 = vmovshdup_avx(auVar48);
      fVar190 = auVar48._0_4_;
      fVar101 = (auVar54._0_4_ - fVar190) * 0.04761905;
      auVar168._4_4_ = fVar190;
      auVar168._0_4_ = fVar190;
      auVar168._8_4_ = fVar190;
      auVar168._12_4_ = fVar190;
      auVar168._16_4_ = fVar190;
      auVar168._20_4_ = fVar190;
      auVar168._24_4_ = fVar190;
      auVar168._28_4_ = fVar190;
      auVar123._0_8_ = auVar54._0_8_;
      auVar123._8_8_ = auVar123._0_8_;
      auVar123._16_8_ = auVar123._0_8_;
      auVar123._24_8_ = auVar123._0_8_;
      auVar73 = vsubps_avx(auVar123,auVar168);
      uVar109 = auVar51._0_4_;
      auVar124._4_4_ = uVar109;
      auVar124._0_4_ = uVar109;
      auVar124._8_4_ = uVar109;
      auVar124._12_4_ = uVar109;
      auVar124._16_4_ = uVar109;
      auVar124._20_4_ = uVar109;
      auVar124._24_4_ = uVar109;
      auVar124._28_4_ = uVar109;
      auVar187._8_4_ = 1;
      auVar187._0_8_ = 0x100000001;
      auVar187._12_4_ = 1;
      auVar187._16_4_ = 1;
      auVar187._20_4_ = 1;
      auVar187._24_4_ = 1;
      auVar187._28_4_ = 1;
      auVar84 = ZEXT1632(auVar51);
      auVar71 = vpermps_avx2(auVar187,auVar84);
      auVar74 = vbroadcastss_avx512vl(auVar52);
      auVar85 = ZEXT1632(auVar52);
      auVar72 = vpermps_avx512vl(auVar187,auVar85);
      auVar75 = vbroadcastss_avx512vl(auVar53);
      auVar69 = ZEXT1632(auVar53);
      auVar76 = vpermps_avx512vl(auVar187,auVar69);
      auVar77 = vbroadcastss_avx512vl(auVar67);
      auVar81 = ZEXT1632(auVar67);
      auVar78 = vpermps_avx512vl(auVar187,auVar81);
      auVar188._4_4_ = fVar101;
      auVar188._0_4_ = fVar101;
      auVar188._8_4_ = fVar101;
      auVar188._12_4_ = fVar101;
      auVar188._16_4_ = fVar101;
      auVar188._20_4_ = fVar101;
      auVar188._24_4_ = fVar101;
      auVar188._28_4_ = fVar101;
      auVar82 = auVar242._0_32_;
      auVar70 = vpermps_avx512vl(auVar82,auVar84);
      auVar158._8_4_ = 3;
      auVar158._0_8_ = 0x300000003;
      auVar158._12_4_ = 3;
      auVar158._16_4_ = 3;
      auVar158._20_4_ = 3;
      auVar158._24_4_ = 3;
      auVar158._28_4_ = 3;
      auVar79 = vpermps_avx512vl(auVar158,auVar84);
      auVar80 = vpermps_avx512vl(auVar82,auVar85);
      auVar84 = vpermps_avx2(auVar158,auVar85);
      auVar68 = vpermps_avx512vl(auVar82,auVar69);
      auVar85 = vpermps_avx2(auVar158,auVar69);
      auVar69 = vpermps_avx512vl(auVar82,auVar81);
      auVar81 = vpermps_avx512vl(auVar158,auVar81);
      auVar54 = vfmadd132ps_fma(auVar73,auVar168,_DAT_01faff20);
      auVar73 = vsubps_avx(auVar228,ZEXT1632(auVar54));
      auVar82 = vmulps_avx512vl(auVar74,ZEXT1632(auVar54));
      auVar86 = ZEXT1632(auVar54);
      auVar83 = vmulps_avx512vl(auVar72,auVar86);
      auVar67 = vfmadd231ps_fma(auVar82,auVar73,auVar124);
      auVar51 = vfmadd231ps_fma(auVar83,auVar73,auVar71);
      auVar82 = vmulps_avx512vl(auVar75,auVar86);
      auVar83 = vmulps_avx512vl(auVar76,auVar86);
      auVar74 = vfmadd231ps_avx512vl(auVar82,auVar73,auVar74);
      auVar72 = vfmadd231ps_avx512vl(auVar83,auVar73,auVar72);
      auVar82 = vmulps_avx512vl(auVar77,auVar86);
      auVar83 = ZEXT1632(auVar54);
      auVar78 = vmulps_avx512vl(auVar78,auVar83);
      auVar75 = vfmadd231ps_avx512vl(auVar82,auVar73,auVar75);
      auVar76 = vfmadd231ps_avx512vl(auVar78,auVar73,auVar76);
      fVar199 = auVar54._0_4_;
      fVar200 = auVar54._4_4_;
      auVar17._4_4_ = fVar200 * auVar74._4_4_;
      auVar17._0_4_ = fVar199 * auVar74._0_4_;
      fVar201 = auVar54._8_4_;
      auVar17._8_4_ = fVar201 * auVar74._8_4_;
      fVar211 = auVar54._12_4_;
      auVar17._12_4_ = fVar211 * auVar74._12_4_;
      auVar17._16_4_ = auVar74._16_4_ * 0.0;
      auVar17._20_4_ = auVar74._20_4_ * 0.0;
      auVar17._24_4_ = auVar74._24_4_ * 0.0;
      auVar17._28_4_ = fVar190;
      auVar18._4_4_ = fVar200 * auVar72._4_4_;
      auVar18._0_4_ = fVar199 * auVar72._0_4_;
      auVar18._8_4_ = fVar201 * auVar72._8_4_;
      auVar18._12_4_ = fVar211 * auVar72._12_4_;
      auVar18._16_4_ = auVar72._16_4_ * 0.0;
      auVar18._20_4_ = auVar72._20_4_ * 0.0;
      auVar18._24_4_ = auVar72._24_4_ * 0.0;
      auVar18._28_4_ = auVar71._28_4_;
      auVar67 = vfmadd231ps_fma(auVar17,auVar73,ZEXT1632(auVar67));
      auVar51 = vfmadd231ps_fma(auVar18,auVar73,ZEXT1632(auVar51));
      auVar116._0_4_ = fVar199 * auVar75._0_4_;
      auVar116._4_4_ = fVar200 * auVar75._4_4_;
      auVar116._8_4_ = fVar201 * auVar75._8_4_;
      auVar116._12_4_ = fVar211 * auVar75._12_4_;
      auVar116._16_4_ = auVar75._16_4_ * 0.0;
      auVar116._20_4_ = auVar75._20_4_ * 0.0;
      auVar116._24_4_ = auVar75._24_4_ * 0.0;
      auVar116._28_4_ = 0;
      auVar19._4_4_ = fVar200 * auVar76._4_4_;
      auVar19._0_4_ = fVar199 * auVar76._0_4_;
      auVar19._8_4_ = fVar201 * auVar76._8_4_;
      auVar19._12_4_ = fVar211 * auVar76._12_4_;
      auVar19._16_4_ = auVar76._16_4_ * 0.0;
      auVar19._20_4_ = auVar76._20_4_ * 0.0;
      auVar19._24_4_ = auVar76._24_4_ * 0.0;
      auVar19._28_4_ = auVar75._28_4_;
      auVar52 = vfmadd231ps_fma(auVar116,auVar73,auVar74);
      auVar53 = vfmadd231ps_fma(auVar19,auVar73,auVar72);
      auVar20._28_4_ = auVar72._28_4_;
      auVar20._0_28_ =
           ZEXT1628(CONCAT412(fVar211 * auVar53._12_4_,
                              CONCAT48(fVar201 * auVar53._8_4_,
                                       CONCAT44(fVar200 * auVar53._4_4_,fVar199 * auVar53._0_4_))));
      auVar62 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar211 * auVar52._12_4_,
                                                   CONCAT48(fVar201 * auVar52._8_4_,
                                                            CONCAT44(fVar200 * auVar52._4_4_,
                                                                     fVar199 * auVar52._0_4_)))),
                                auVar73,ZEXT1632(auVar67));
      auVar63 = vfmadd231ps_fma(auVar20,auVar73,ZEXT1632(auVar51));
      auVar71 = vsubps_avx(ZEXT1632(auVar52),ZEXT1632(auVar67));
      auVar74 = vsubps_avx(ZEXT1632(auVar53),ZEXT1632(auVar51));
      auVar72 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar71 = vmulps_avx512vl(auVar71,auVar72);
      auVar74 = vmulps_avx512vl(auVar74,auVar72);
      auVar180._0_4_ = fVar101 * auVar71._0_4_;
      auVar180._4_4_ = fVar101 * auVar71._4_4_;
      auVar180._8_4_ = fVar101 * auVar71._8_4_;
      auVar180._12_4_ = fVar101 * auVar71._12_4_;
      auVar180._16_4_ = fVar101 * auVar71._16_4_;
      auVar180._20_4_ = fVar101 * auVar71._20_4_;
      auVar180._24_4_ = fVar101 * auVar71._24_4_;
      auVar180._28_4_ = 0;
      auVar71 = vmulps_avx512vl(auVar188,auVar74);
      auVar51 = vxorps_avx512vl(auVar77._0_16_,auVar77._0_16_);
      auVar74 = vpermt2ps_avx512vl(ZEXT1632(auVar62),_DAT_01feed00,ZEXT1632(auVar51));
      auVar75 = vpermt2ps_avx512vl(ZEXT1632(auVar63),_DAT_01feed00,ZEXT1632(auVar51));
      auVar117._0_4_ = auVar180._0_4_ + auVar62._0_4_;
      auVar117._4_4_ = auVar180._4_4_ + auVar62._4_4_;
      auVar117._8_4_ = auVar180._8_4_ + auVar62._8_4_;
      auVar117._12_4_ = auVar180._12_4_ + auVar62._12_4_;
      auVar117._16_4_ = auVar180._16_4_ + 0.0;
      auVar117._20_4_ = auVar180._20_4_ + 0.0;
      auVar117._24_4_ = auVar180._24_4_ + 0.0;
      auVar117._28_4_ = 0;
      auVar86 = ZEXT1632(auVar51);
      auVar76 = vpermt2ps_avx512vl(auVar180,_DAT_01feed00,auVar86);
      auVar77 = vaddps_avx512vl(ZEXT1632(auVar63),auVar71);
      auVar78 = vpermt2ps_avx512vl(auVar71,_DAT_01feed00,auVar86);
      auVar71 = vsubps_avx(auVar74,auVar76);
      auVar76 = vsubps_avx512vl(auVar75,auVar78);
      auVar78 = vmulps_avx512vl(auVar80,auVar83);
      auVar82 = vmulps_avx512vl(auVar84,auVar83);
      auVar78 = vfmadd231ps_avx512vl(auVar78,auVar73,auVar70);
      auVar70 = vfmadd231ps_avx512vl(auVar82,auVar73,auVar79);
      auVar79 = vmulps_avx512vl(auVar68,auVar83);
      auVar82 = vmulps_avx512vl(auVar85,auVar83);
      auVar79 = vfmadd231ps_avx512vl(auVar79,auVar73,auVar80);
      auVar84 = vfmadd231ps_avx512vl(auVar82,auVar73,auVar84);
      auVar80 = vmulps_avx512vl(auVar69,auVar83);
      auVar69 = vmulps_avx512vl(auVar81,auVar83);
      auVar67 = vfmadd231ps_fma(auVar80,auVar73,auVar68);
      auVar80 = vfmadd231ps_avx512vl(auVar69,auVar73,auVar85);
      auVar68 = vmulps_avx512vl(auVar83,auVar79);
      auVar81 = ZEXT1632(auVar54);
      auVar69 = vmulps_avx512vl(auVar81,auVar84);
      auVar78 = vfmadd231ps_avx512vl(auVar68,auVar73,auVar78);
      auVar70 = vfmadd231ps_avx512vl(auVar69,auVar73,auVar70);
      auVar80 = vmulps_avx512vl(auVar81,auVar80);
      auVar79 = vfmadd231ps_avx512vl
                          (ZEXT1632(CONCAT412(fVar211 * auVar67._12_4_,
                                              CONCAT48(fVar201 * auVar67._8_4_,
                                                       CONCAT44(fVar200 * auVar67._4_4_,
                                                                fVar199 * auVar67._0_4_)))),auVar73,
                           auVar79);
      auVar84 = vfmadd231ps_avx512vl(auVar80,auVar73,auVar84);
      auVar21._4_4_ = fVar200 * auVar79._4_4_;
      auVar21._0_4_ = fVar199 * auVar79._0_4_;
      auVar21._8_4_ = fVar201 * auVar79._8_4_;
      auVar21._12_4_ = fVar211 * auVar79._12_4_;
      auVar21._16_4_ = auVar79._16_4_ * 0.0;
      auVar21._20_4_ = auVar79._20_4_ * 0.0;
      auVar21._24_4_ = auVar79._24_4_ * 0.0;
      auVar21._28_4_ = auVar85._28_4_;
      auVar85 = vmulps_avx512vl(auVar81,auVar84);
      auVar80 = vfmadd231ps_avx512vl(auVar21,auVar73,auVar78);
      auVar85 = vfmadd231ps_avx512vl(auVar85,auVar70,auVar73);
      auVar73 = vsubps_avx512vl(auVar79,auVar78);
      auVar84 = vsubps_avx512vl(auVar84,auVar70);
      auVar73 = vmulps_avx512vl(auVar73,auVar72);
      auVar84 = vmulps_avx512vl(auVar84,auVar72);
      fVar190 = fVar101 * auVar73._0_4_;
      fVar199 = fVar101 * auVar73._4_4_;
      auVar22._4_4_ = fVar199;
      auVar22._0_4_ = fVar190;
      fVar200 = fVar101 * auVar73._8_4_;
      auVar22._8_4_ = fVar200;
      fVar201 = fVar101 * auVar73._12_4_;
      auVar22._12_4_ = fVar201;
      fVar211 = fVar101 * auVar73._16_4_;
      auVar22._16_4_ = fVar211;
      fVar212 = fVar101 * auVar73._20_4_;
      auVar22._20_4_ = fVar212;
      fVar101 = fVar101 * auVar73._24_4_;
      auVar22._24_4_ = fVar101;
      auVar22._28_4_ = auVar73._28_4_;
      auVar84 = vmulps_avx512vl(auVar188,auVar84);
      auVar72 = vpermt2ps_avx512vl(auVar80,_DAT_01feed00,auVar86);
      auVar78 = vpermt2ps_avx512vl(auVar85,_DAT_01feed00,auVar86);
      auVar189._0_4_ = auVar80._0_4_ + fVar190;
      auVar189._4_4_ = auVar80._4_4_ + fVar199;
      auVar189._8_4_ = auVar80._8_4_ + fVar200;
      auVar189._12_4_ = auVar80._12_4_ + fVar201;
      auVar189._16_4_ = auVar80._16_4_ + fVar211;
      auVar189._20_4_ = auVar80._20_4_ + fVar212;
      auVar189._24_4_ = auVar80._24_4_ + fVar101;
      auVar189._28_4_ = auVar80._28_4_ + auVar73._28_4_;
      auVar73 = vpermt2ps_avx512vl(auVar22,_DAT_01feed00,ZEXT1632(auVar51));
      auVar70 = vaddps_avx512vl(auVar85,auVar84);
      auVar84 = vpermt2ps_avx512vl(auVar84,_DAT_01feed00,ZEXT1632(auVar51));
      auVar73 = vsubps_avx(auVar72,auVar73);
      auVar84 = vsubps_avx512vl(auVar78,auVar84);
      auVar130 = ZEXT1632(auVar62);
      auVar79 = vsubps_avx512vl(auVar80,auVar130);
      auVar141 = ZEXT1632(auVar63);
      auVar68 = vsubps_avx512vl(auVar85,auVar141);
      auVar69 = vsubps_avx512vl(auVar72,auVar74);
      auVar79 = vaddps_avx512vl(auVar79,auVar69);
      auVar69 = vsubps_avx512vl(auVar78,auVar75);
      auVar68 = vaddps_avx512vl(auVar68,auVar69);
      auVar69 = vmulps_avx512vl(auVar141,auVar79);
      auVar69 = vfnmadd231ps_avx512vl(auVar69,auVar130,auVar68);
      auVar81 = vmulps_avx512vl(auVar77,auVar79);
      auVar81 = vfnmadd231ps_avx512vl(auVar81,auVar117,auVar68);
      auVar82 = vmulps_avx512vl(auVar76,auVar79);
      auVar82 = vfnmadd231ps_avx512vl(auVar82,auVar71,auVar68);
      auVar83 = vmulps_avx512vl(auVar75,auVar79);
      auVar83 = vfnmadd231ps_avx512vl(auVar83,auVar74,auVar68);
      auVar86 = vmulps_avx512vl(auVar85,auVar79);
      auVar86 = vfnmadd231ps_avx512vl(auVar86,auVar80,auVar68);
      auVar87 = vmulps_avx512vl(auVar70,auVar79);
      auVar87 = vfnmadd231ps_avx512vl(auVar87,auVar189,auVar68);
      auVar88 = vmulps_avx512vl(auVar84,auVar79);
      auVar88 = vfnmadd231ps_avx512vl(auVar88,auVar73,auVar68);
      auVar79 = vmulps_avx512vl(auVar78,auVar79);
      auVar79 = vfnmadd231ps_avx512vl(auVar79,auVar72,auVar68);
      auVar68 = vminps_avx512vl(auVar69,auVar81);
      auVar69 = vmaxps_avx512vl(auVar69,auVar81);
      auVar81 = vminps_avx512vl(auVar82,auVar83);
      auVar68 = vminps_avx512vl(auVar68,auVar81);
      auVar81 = vmaxps_avx512vl(auVar82,auVar83);
      auVar69 = vmaxps_avx512vl(auVar69,auVar81);
      auVar81 = vminps_avx512vl(auVar86,auVar87);
      auVar82 = vmaxps_avx512vl(auVar86,auVar87);
      auVar83 = vminps_avx512vl(auVar88,auVar79);
      auVar81 = vminps_avx512vl(auVar81,auVar83);
      auVar68 = vminps_avx512vl(auVar68,auVar81);
      auVar79 = vmaxps_avx512vl(auVar88,auVar79);
      auVar79 = vmaxps_avx512vl(auVar82,auVar79);
      auVar79 = vmaxps_avx512vl(auVar69,auVar79);
      uVar11 = vcmpps_avx512vl(auVar68,local_148,2);
      uVar12 = vcmpps_avx512vl(auVar79,local_168,5);
      bVar26 = (byte)uVar11 & (byte)uVar12 & 0x7f;
      if (bVar26 != 0) {
        auVar79 = vsubps_avx512vl(auVar74,auVar130);
        auVar68 = vsubps_avx512vl(auVar75,auVar141);
        auVar69 = vsubps_avx512vl(auVar72,auVar80);
        auVar79 = vaddps_avx512vl(auVar79,auVar69);
        auVar69 = vsubps_avx512vl(auVar78,auVar85);
        auVar68 = vaddps_avx512vl(auVar68,auVar69);
        auVar69 = vmulps_avx512vl(auVar141,auVar79);
        auVar69 = vfnmadd231ps_avx512vl(auVar69,auVar68,auVar130);
        auVar77 = vmulps_avx512vl(auVar77,auVar79);
        auVar77 = vfnmadd213ps_avx512vl(auVar117,auVar68,auVar77);
        auVar76 = vmulps_avx512vl(auVar76,auVar79);
        auVar76 = vfnmadd213ps_avx512vl(auVar71,auVar68,auVar76);
        auVar71 = vmulps_avx512vl(auVar75,auVar79);
        auVar75 = vfnmadd231ps_avx512vl(auVar71,auVar68,auVar74);
        auVar71 = vmulps_avx512vl(auVar85,auVar79);
        auVar85 = vfnmadd231ps_avx512vl(auVar71,auVar68,auVar80);
        auVar71 = vmulps_avx512vl(auVar70,auVar79);
        auVar70 = vfnmadd213ps_avx512vl(auVar189,auVar68,auVar71);
        auVar71 = vmulps_avx512vl(auVar84,auVar79);
        auVar80 = vfnmadd213ps_avx512vl(auVar73,auVar68,auVar71);
        auVar73 = vmulps_avx512vl(auVar78,auVar79);
        auVar72 = vfnmadd231ps_avx512vl(auVar73,auVar72,auVar68);
        auVar71 = vminps_avx(auVar69,auVar77);
        auVar73 = vmaxps_avx(auVar69,auVar77);
        auVar74 = vminps_avx(auVar76,auVar75);
        auVar74 = vminps_avx(auVar71,auVar74);
        auVar71 = vmaxps_avx(auVar76,auVar75);
        auVar73 = vmaxps_avx(auVar73,auVar71);
        auVar84 = vminps_avx(auVar85,auVar70);
        auVar71 = vmaxps_avx(auVar85,auVar70);
        auVar85 = vminps_avx(auVar80,auVar72);
        auVar84 = vminps_avx(auVar84,auVar85);
        auVar84 = vminps_avx(auVar74,auVar84);
        auVar74 = vmaxps_avx(auVar80,auVar72);
        auVar71 = vmaxps_avx(auVar71,auVar74);
        auVar73 = vmaxps_avx(auVar73,auVar71);
        uVar11 = vcmpps_avx512vl(auVar73,local_168,5);
        uVar12 = vcmpps_avx512vl(auVar84,local_148,2);
        bVar26 = bVar26 & (byte)uVar11 & (byte)uVar12;
        if (bVar26 != 0) {
          auStack_318[uVar28] = (uint)bVar26;
          uVar11 = vmovlps_avx(auVar48);
          (&uStack_128)[uVar28] = uVar11;
          uVar35 = vmovlps_avx(auVar41);
          auStack_58[uVar28] = uVar35;
          uVar28 = (ulong)((int)uVar28 + 1);
        }
      }
      auVar48 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar235 = ZEXT1664(auVar48);
      auVar48 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar236 = ZEXT1664(auVar48);
      auVar48 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar237 = ZEXT1664(auVar48);
      auVar73 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar238 = ZEXT3264(auVar73);
      auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar239 = ZEXT1664(auVar48);
      auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar240 = ZEXT1664(auVar48);
      auVar241 = ZEXT3264(_DAT_01feed20);
      if ((int)uVar28 != 0) {
        do {
          uVar27 = (int)uVar28 - 1;
          uVar29 = (ulong)uVar27;
          uVar6 = auStack_318[uVar29];
          auVar41._8_8_ = 0;
          auVar41._0_8_ = auStack_58[uVar29];
          uVar35 = 0;
          for (uVar32 = (ulong)uVar6; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000)
          {
            uVar35 = uVar35 + 1;
          }
          uVar31 = uVar6 - 1 & uVar6;
          bVar38 = uVar31 == 0;
          auStack_318[uVar29] = uVar31;
          if (bVar38) {
            uVar28 = (ulong)uVar27;
          }
          auVar102._8_8_ = 0;
          auVar102._0_8_ = uVar35;
          auVar48 = vpunpcklqdq_avx(auVar102,ZEXT416((int)uVar35 + 1));
          auVar48 = vcvtqq2ps_avx512vl(auVar48);
          auVar48 = vmulps_avx512vl(auVar48,auVar239._0_16_);
          uVar109 = *(undefined4 *)((long)&uStack_128 + uVar29 * 8 + 4);
          auVar13._4_4_ = uVar109;
          auVar13._0_4_ = uVar109;
          auVar13._8_4_ = uVar109;
          auVar13._12_4_ = uVar109;
          auVar54 = vmulps_avx512vl(auVar48,auVar13);
          auVar67 = auVar240._0_16_;
          auVar48 = vsubps_avx512vl(auVar67,auVar48);
          uVar109 = *(undefined4 *)(&uStack_128 + uVar29);
          auVar14._4_4_ = uVar109;
          auVar14._0_4_ = uVar109;
          auVar14._8_4_ = uVar109;
          auVar14._12_4_ = uVar109;
          auVar48 = vfmadd231ps_avx512vl(auVar54,auVar48,auVar14);
          auVar54 = vmovshdup_avx(auVar48);
          fVar101 = auVar54._0_4_ - auVar48._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar101));
          if (uVar6 == 0 || bVar38) goto LAB_01c92d73;
          auVar54 = vshufps_avx(auVar41,auVar41,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar101));
          auVar53 = vsubps_avx512vl(auVar67,auVar54);
          fVar190 = auVar54._0_4_;
          auVar136._0_4_ = fVar190 * fVar106;
          fVar199 = auVar54._4_4_;
          auVar136._4_4_ = fVar199 * fVar107;
          fVar200 = auVar54._8_4_;
          auVar136._8_4_ = fVar200 * fVar106;
          fVar201 = auVar54._12_4_;
          auVar136._12_4_ = fVar201 * fVar107;
          auVar147._0_4_ = fVar190 * fVar108;
          auVar147._4_4_ = fVar199 * fVar118;
          auVar147._8_4_ = fVar200 * fVar108;
          auVar147._12_4_ = fVar201 * fVar118;
          auVar154._0_4_ = fVar190 * fVar125;
          auVar154._4_4_ = fVar199 * fVar132;
          auVar154._8_4_ = fVar200 * fVar125;
          auVar154._12_4_ = fVar201 * fVar132;
          auVar120._0_4_ = fVar190 * fVar133;
          auVar120._4_4_ = fVar199 * fVar134;
          auVar120._8_4_ = fVar200 * fVar133;
          auVar120._12_4_ = fVar201 * fVar134;
          auVar54 = vfmadd231ps_fma(auVar136,auVar53,auVar49);
          auVar51 = vfmadd231ps_fma(auVar147,auVar53,auVar50);
          auVar52 = vfmadd231ps_fma(auVar154,auVar53,auVar45);
          auVar53 = vfmadd231ps_fma(auVar120,auVar111,auVar53);
          auVar131._16_16_ = auVar54;
          auVar131._0_16_ = auVar54;
          auVar142._16_16_ = auVar51;
          auVar142._0_16_ = auVar51;
          auVar151._16_16_ = auVar52;
          auVar151._0_16_ = auVar52;
          auVar71 = vpermps_avx512vl(auVar241._0_32_,ZEXT1632(auVar48));
          auVar73 = vsubps_avx(auVar142,auVar131);
          auVar51 = vfmadd213ps_fma(auVar73,auVar71,auVar131);
          auVar73 = vsubps_avx(auVar151,auVar142);
          auVar62 = vfmadd213ps_fma(auVar73,auVar71,auVar142);
          auVar54 = vsubps_avx(auVar53,auVar52);
          auVar143._16_16_ = auVar54;
          auVar143._0_16_ = auVar54;
          auVar54 = vfmadd213ps_fma(auVar143,auVar71,auVar151);
          auVar73 = vsubps_avx(ZEXT1632(auVar62),ZEXT1632(auVar51));
          auVar51 = vfmadd213ps_fma(auVar73,auVar71,ZEXT1632(auVar51));
          auVar73 = vsubps_avx(ZEXT1632(auVar54),ZEXT1632(auVar62));
          auVar54 = vfmadd213ps_fma(auVar73,auVar71,ZEXT1632(auVar62));
          auVar73 = vsubps_avx(ZEXT1632(auVar54),ZEXT1632(auVar51));
          auVar144 = vfmadd231ps_fma(ZEXT1632(auVar51),auVar73,auVar71);
          auVar73 = vmulps_avx512vl(auVar73,auVar238._0_32_);
          auVar90._16_16_ = auVar73._16_16_;
          fVar190 = fVar101 * 0.33333334;
          auVar155._0_8_ =
               CONCAT44(auVar144._4_4_ + fVar190 * auVar73._4_4_,
                        auVar144._0_4_ + fVar190 * auVar73._0_4_);
          auVar155._8_4_ = auVar144._8_4_ + fVar190 * auVar73._8_4_;
          auVar155._12_4_ = auVar144._12_4_ + fVar190 * auVar73._12_4_;
          auVar137._0_4_ = fVar190 * auVar73._16_4_;
          auVar137._4_4_ = fVar190 * auVar73._20_4_;
          auVar137._8_4_ = fVar190 * auVar73._24_4_;
          auVar137._12_4_ = fVar190 * auVar73._28_4_;
          auVar61 = vsubps_avx((undefined1  [16])0x0,auVar137);
          auVar62 = vshufpd_avx(auVar144,auVar144,3);
          auVar63 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar54 = vsubps_avx(auVar62,auVar144);
          auVar51 = vsubps_avx(auVar63,(undefined1  [16])0x0);
          auVar172._0_4_ = auVar54._0_4_ + auVar51._0_4_;
          auVar172._4_4_ = auVar54._4_4_ + auVar51._4_4_;
          auVar172._8_4_ = auVar54._8_4_ + auVar51._8_4_;
          auVar172._12_4_ = auVar54._12_4_ + auVar51._12_4_;
          auVar54 = vshufps_avx(auVar144,auVar144,0xb1);
          auVar51 = vshufps_avx(auVar155,auVar155,0xb1);
          auVar52 = vshufps_avx(auVar61,auVar61,0xb1);
          auVar53 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar226._4_4_ = auVar172._0_4_;
          auVar226._0_4_ = auVar172._0_4_;
          auVar226._8_4_ = auVar172._0_4_;
          auVar226._12_4_ = auVar172._0_4_;
          auVar57 = vshufps_avx(auVar172,auVar172,0x55);
          fVar190 = auVar57._0_4_;
          auVar183._0_4_ = auVar54._0_4_ * fVar190;
          fVar199 = auVar57._4_4_;
          auVar183._4_4_ = auVar54._4_4_ * fVar199;
          fVar200 = auVar57._8_4_;
          auVar183._8_4_ = auVar54._8_4_ * fVar200;
          fVar201 = auVar57._12_4_;
          auVar183._12_4_ = auVar54._12_4_ * fVar201;
          auVar192._0_4_ = auVar51._0_4_ * fVar190;
          auVar192._4_4_ = auVar51._4_4_ * fVar199;
          auVar192._8_4_ = auVar51._8_4_ * fVar200;
          auVar192._12_4_ = auVar51._12_4_ * fVar201;
          auVar204._0_4_ = auVar52._0_4_ * fVar190;
          auVar204._4_4_ = auVar52._4_4_ * fVar199;
          auVar204._8_4_ = auVar52._8_4_ * fVar200;
          auVar204._12_4_ = auVar52._12_4_ * fVar201;
          auVar173._0_4_ = auVar53._0_4_ * fVar190;
          auVar173._4_4_ = auVar53._4_4_ * fVar199;
          auVar173._8_4_ = auVar53._8_4_ * fVar200;
          auVar173._12_4_ = auVar53._12_4_ * fVar201;
          auVar54 = vfmadd231ps_fma(auVar183,auVar226,auVar144);
          auVar51 = vfmadd231ps_fma(auVar192,auVar226,auVar155);
          auVar59 = vfmadd231ps_fma(auVar204,auVar226,auVar61);
          auVar60 = vfmadd231ps_fma(auVar173,(undefined1  [16])0x0,auVar226);
          auVar57 = vshufpd_avx(auVar54,auVar54,1);
          auVar58 = vshufpd_avx(auVar51,auVar51,1);
          auVar55 = vshufpd_avx512vl(auVar59,auVar59,1);
          auVar56 = vshufpd_avx512vl(auVar60,auVar60,1);
          auVar52 = vminss_avx(auVar54,auVar51);
          auVar54 = vmaxss_avx(auVar51,auVar54);
          auVar53 = vminss_avx(auVar59,auVar60);
          auVar51 = vmaxss_avx(auVar60,auVar59);
          auVar52 = vminss_avx(auVar52,auVar53);
          auVar54 = vmaxss_avx(auVar51,auVar54);
          auVar53 = vminss_avx(auVar57,auVar58);
          auVar51 = vmaxss_avx(auVar58,auVar57);
          auVar57 = vminss_avx512f(auVar55,auVar56);
          auVar58 = vmaxss_avx512f(auVar56,auVar55);
          auVar51 = vmaxss_avx(auVar58,auVar51);
          auVar53 = vminss_avx512f(auVar53,auVar57);
          fVar199 = auVar51._0_4_;
          fVar190 = auVar54._0_4_;
          if (0.0001 <= auVar52._0_4_) {
LAB_01c934a6:
            vucomiss_avx512f(auVar53);
            bVar39 = fVar199 <= -0.0001;
            bVar37 = -0.0001 < fVar190;
            bVar36 = bVar39;
            if (!bVar39) goto LAB_01c934fc;
            uVar11 = vcmpps_avx512vl(auVar52,SUB6416(ZEXT464(0x38d1b717),0),5);
            uVar12 = vcmpps_avx512vl(auVar53,SUB6416(ZEXT464(0x38d1b717),0),5);
            bVar26 = (byte)uVar11 & (byte)uVar12 & 1;
            bVar39 = bVar37 && bVar26 == 0;
            bVar36 = bVar37 && bVar26 == 0;
            if (bVar37 && bVar26 == 0) goto LAB_01c934fc;
          }
          else {
            bVar39 = fVar199 == -0.0001;
            bVar36 = NAN(fVar199);
            if (fVar199 <= -0.0001) goto LAB_01c934a6;
LAB_01c934fc:
            auVar59 = auVar243._0_16_;
            vcmpss_avx512f(auVar52,auVar59,1);
            uVar11 = vcmpss_avx512f(auVar54,auVar59,1);
            bVar37 = (bool)((byte)uVar11 & 1);
            auVar90._0_16_ = auVar244._0_16_;
            auVar89._4_28_ = auVar90._4_28_;
            auVar89._0_4_ = (float)((uint)bVar37 * -0x40800000 + (uint)!bVar37 * auVar244._0_4_);
            vucomiss_avx512f(auVar89._0_16_);
            bVar36 = (bool)(!bVar39 | bVar36);
            bVar37 = bVar36 == false;
            auVar92._16_16_ = auVar90._16_16_;
            auVar92._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar91._4_28_ = auVar92._4_28_;
            auVar91._0_4_ = (uint)bVar36 * auVar243._0_4_ + (uint)!bVar36 * 0x7f800000;
            auVar58 = auVar91._0_16_;
            auVar94._16_16_ = auVar90._16_16_;
            auVar94._0_16_ = SUB6416(ZEXT464(0xff800000),0);
            auVar93._4_28_ = auVar94._4_28_;
            auVar93._0_4_ = (uint)bVar36 * auVar243._0_4_ + (uint)!bVar36 * -0x800000;
            auVar57 = auVar93._0_16_;
            uVar11 = vcmpss_avx512f(auVar53,auVar59,1);
            bVar39 = (bool)((byte)uVar11 & 1);
            auVar96._16_16_ = auVar90._16_16_;
            auVar96._0_16_ = auVar244._0_16_;
            auVar95._4_28_ = auVar96._4_28_;
            auVar95._0_4_ = (float)((uint)bVar39 * -0x40800000 + (uint)!bVar39 * auVar244._0_4_);
            vucomiss_avx512f(auVar95._0_16_);
            if ((bVar36) || (bVar37)) {
              auVar53 = vucomiss_avx512f(auVar52);
              if ((bVar36) || (bVar37)) {
                auVar60 = vxorps_avx512vl(auVar52,auVar237._0_16_);
                auVar52 = vsubss_avx512f(auVar53,auVar52);
                auVar52 = vdivss_avx512f(auVar60,auVar52);
                auVar53 = vsubss_avx512f(ZEXT416(0x3f800000),auVar52);
                auVar53 = vfmadd213ss_avx512f(auVar53,auVar59,auVar52);
                auVar52 = auVar53;
              }
              else {
                auVar53 = vxorps_avx512vl(auVar53,auVar53);
                vucomiss_avx512f(auVar53);
                if ((bVar36) || (auVar52 = ZEXT416(0x3f800000), bVar37)) {
                  auVar53 = ZEXT416(0x7f800000);
                  auVar52 = SUB6416(ZEXT464(0xff800000),0);
                }
              }
              auVar58 = vminss_avx512f(auVar58,auVar53);
              auVar57 = vmaxss_avx(auVar52,auVar57);
            }
            auVar244 = ZEXT464(0x3f800000);
            uVar11 = vcmpss_avx512f(auVar51,auVar59,1);
            bVar39 = (bool)((byte)uVar11 & 1);
            auVar51 = auVar244._0_16_;
            fVar200 = (float)((uint)bVar39 * -0x40800000 + (uint)!bVar39 * 0x3f800000);
            if ((auVar89._0_4_ != fVar200) || (NAN(auVar89._0_4_) || NAN(fVar200))) {
              if ((fVar199 != fVar190) || (NAN(fVar199) || NAN(fVar190))) {
                auVar54 = vxorps_avx512vl(auVar54,auVar237._0_16_);
                auVar174._0_4_ = auVar54._0_4_ / (fVar199 - fVar190);
                auVar174._4_12_ = auVar54._4_12_;
                auVar54 = vsubss_avx512f(auVar51,auVar174);
                auVar54 = vfmadd213ss_avx512f(auVar54,auVar59,auVar174);
                auVar52 = auVar54;
              }
              else if ((fVar190 != 0.0) ||
                      (auVar54 = auVar51, auVar52 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar190))) {
                auVar54 = SUB6416(ZEXT464(0xff800000),0);
                auVar52 = SUB6416(ZEXT464(0x7f800000),0);
              }
              auVar58 = vminss_avx(auVar58,auVar52);
              auVar57 = vmaxss_avx(auVar54,auVar57);
            }
            bVar39 = auVar95._0_4_ != fVar200;
            auVar54 = vminss_avx512f(auVar58,auVar51);
            auVar98._16_16_ = auVar90._16_16_;
            auVar98._0_16_ = auVar58;
            auVar97._4_28_ = auVar98._4_28_;
            auVar97._0_4_ = (uint)bVar39 * auVar54._0_4_ + (uint)!bVar39 * auVar58._0_4_;
            auVar54 = vmaxss_avx512f(auVar51,auVar57);
            auVar100._16_16_ = auVar90._16_16_;
            auVar100._0_16_ = auVar57;
            auVar99._4_28_ = auVar100._4_28_;
            auVar99._0_4_ = (uint)bVar39 * auVar54._0_4_ + (uint)!bVar39 * auVar57._0_4_;
            auVar54 = vmaxss_avx512f(auVar59,auVar97._0_16_);
            auVar52 = vminss_avx512f(auVar99._0_16_,auVar51);
            if (auVar54._0_4_ <= auVar52._0_4_) {
              auVar59 = vmaxss_avx512f(auVar59,ZEXT416((uint)(auVar54._0_4_ + -0.1)));
              auVar60 = vminss_avx512f(ZEXT416((uint)(auVar52._0_4_ + 0.1)),auVar51);
              auVar121._0_8_ = auVar144._0_8_;
              auVar121._8_8_ = auVar121._0_8_;
              auVar193._8_8_ = auVar155._0_8_;
              auVar193._0_8_ = auVar155._0_8_;
              auVar205._8_8_ = auVar61._0_8_;
              auVar205._0_8_ = auVar61._0_8_;
              auVar54 = vshufpd_avx(auVar155,auVar155,3);
              auVar52 = vshufpd_avx(auVar61,auVar61,3);
              auVar53 = vshufps_avx(auVar59,auVar60,0);
              auVar58 = vsubps_avx512vl(auVar67,auVar53);
              fVar190 = auVar53._0_4_;
              auVar148._0_4_ = fVar190 * auVar62._0_4_;
              fVar199 = auVar53._4_4_;
              auVar148._4_4_ = fVar199 * auVar62._4_4_;
              fVar200 = auVar53._8_4_;
              auVar148._8_4_ = fVar200 * auVar62._8_4_;
              fVar201 = auVar53._12_4_;
              auVar148._12_4_ = fVar201 * auVar62._12_4_;
              auVar156._0_4_ = fVar190 * auVar54._0_4_;
              auVar156._4_4_ = fVar199 * auVar54._4_4_;
              auVar156._8_4_ = fVar200 * auVar54._8_4_;
              auVar156._12_4_ = fVar201 * auVar54._12_4_;
              auVar229._0_4_ = auVar52._0_4_ * fVar190;
              auVar229._4_4_ = auVar52._4_4_ * fVar199;
              auVar229._8_4_ = auVar52._8_4_ * fVar200;
              auVar229._12_4_ = auVar52._12_4_ * fVar201;
              auVar138._0_4_ = fVar190 * auVar63._0_4_;
              auVar138._4_4_ = fVar199 * auVar63._4_4_;
              auVar138._8_4_ = fVar200 * auVar63._8_4_;
              auVar138._12_4_ = fVar201 * auVar63._12_4_;
              auVar62 = vfmadd231ps_fma(auVar148,auVar58,auVar121);
              auVar63 = vfmadd231ps_fma(auVar156,auVar58,auVar193);
              auVar57 = vfmadd231ps_fma(auVar229,auVar58,auVar205);
              auVar58 = vfmadd231ps_fma(auVar138,auVar58,ZEXT816(0));
              auVar52 = vsubss_avx512f(auVar51,auVar59);
              auVar54 = vmovshdup_avx(auVar41);
              auVar144 = vfmadd231ss_fma(ZEXT416((uint)(auVar54._0_4_ * auVar59._0_4_)),auVar41,
                                         auVar52);
              auVar52 = vsubss_avx512f(auVar51,auVar60);
              auVar55 = vfmadd231ss_fma(ZEXT416((uint)(auVar54._0_4_ * auVar60._0_4_)),auVar41,
                                        auVar52);
              auVar61 = vdivss_avx512f(auVar51,ZEXT416((uint)fVar101));
              auVar41 = vsubps_avx(auVar63,auVar62);
              auVar145 = auVar235._0_16_;
              auVar52 = vmulps_avx512vl(auVar41,auVar145);
              auVar41 = vsubps_avx(auVar57,auVar63);
              auVar53 = vmulps_avx512vl(auVar41,auVar145);
              auVar41 = vsubps_avx(auVar58,auVar57);
              auVar41 = vmulps_avx512vl(auVar41,auVar145);
              auVar54 = vminps_avx(auVar53,auVar41);
              auVar41 = vmaxps_avx(auVar53,auVar41);
              auVar54 = vminps_avx(auVar52,auVar54);
              auVar41 = vmaxps_avx(auVar52,auVar41);
              auVar52 = vshufpd_avx(auVar54,auVar54,3);
              auVar53 = vshufpd_avx(auVar41,auVar41,3);
              auVar54 = vminps_avx(auVar54,auVar52);
              auVar41 = vmaxps_avx(auVar41,auVar53);
              fVar101 = auVar61._0_4_;
              auVar175._0_4_ = auVar54._0_4_ * fVar101;
              auVar175._4_4_ = auVar54._4_4_ * fVar101;
              auVar175._8_4_ = auVar54._8_4_ * fVar101;
              auVar175._12_4_ = auVar54._12_4_ * fVar101;
              auVar164._0_4_ = fVar101 * auVar41._0_4_;
              auVar164._4_4_ = fVar101 * auVar41._4_4_;
              auVar164._8_4_ = fVar101 * auVar41._8_4_;
              auVar164._12_4_ = fVar101 * auVar41._12_4_;
              auVar61 = vdivss_avx512f(auVar51,ZEXT416((uint)(auVar55._0_4_ - auVar144._0_4_)));
              auVar41 = vshufpd_avx(auVar62,auVar62,3);
              auVar54 = vshufpd_avx(auVar63,auVar63,3);
              auVar52 = vshufpd_avx(auVar57,auVar57,3);
              auVar53 = vshufpd_avx(auVar58,auVar58,3);
              auVar41 = vsubps_avx(auVar41,auVar62);
              auVar62 = vsubps_avx(auVar54,auVar63);
              auVar63 = vsubps_avx(auVar52,auVar57);
              auVar53 = vsubps_avx(auVar53,auVar58);
              auVar54 = vminps_avx(auVar41,auVar62);
              auVar41 = vmaxps_avx(auVar41,auVar62);
              auVar52 = vminps_avx(auVar63,auVar53);
              auVar52 = vminps_avx(auVar54,auVar52);
              auVar54 = vmaxps_avx(auVar63,auVar53);
              auVar41 = vmaxps_avx(auVar41,auVar54);
              fVar101 = auVar61._0_4_;
              auVar206._0_4_ = fVar101 * auVar52._0_4_;
              auVar206._4_4_ = fVar101 * auVar52._4_4_;
              auVar206._8_4_ = fVar101 * auVar52._8_4_;
              auVar206._12_4_ = fVar101 * auVar52._12_4_;
              auVar194._0_4_ = fVar101 * auVar41._0_4_;
              auVar194._4_4_ = fVar101 * auVar41._4_4_;
              auVar194._8_4_ = fVar101 * auVar41._8_4_;
              auVar194._12_4_ = fVar101 * auVar41._12_4_;
              auVar53 = vinsertps_avx(auVar48,auVar144,0x10);
              auVar56 = vpermt2ps_avx512vl(auVar48,_DAT_01feecd0,auVar55);
              auVar112._0_4_ = auVar53._0_4_ + auVar56._0_4_;
              auVar112._4_4_ = auVar53._4_4_ + auVar56._4_4_;
              auVar112._8_4_ = auVar53._8_4_ + auVar56._8_4_;
              auVar112._12_4_ = auVar53._12_4_ + auVar56._12_4_;
              auVar15._8_4_ = 0x3f000000;
              auVar15._0_8_ = 0x3f0000003f000000;
              auVar15._12_4_ = 0x3f000000;
              auVar61 = vmulps_avx512vl(auVar112,auVar15);
              auVar54 = vshufps_avx(auVar61,auVar61,0x54);
              uVar109 = auVar61._0_4_;
              auVar114._4_4_ = uVar109;
              auVar114._0_4_ = uVar109;
              auVar114._8_4_ = uVar109;
              auVar114._12_4_ = uVar109;
              auVar62 = vfmadd213ps_avx512vl(auVar40,auVar114,auVar47);
              auVar63 = vfmadd213ps_avx512vl(auVar44,auVar114,auVar46);
              auVar52 = vfmadd213ps_fma(local_198,auVar114,local_328);
              auVar41 = vsubps_avx(auVar63,auVar62);
              auVar62 = vfmadd213ps_fma(auVar41,auVar114,auVar62);
              auVar41 = vsubps_avx(auVar52,auVar63);
              auVar41 = vfmadd213ps_fma(auVar41,auVar114,auVar63);
              auVar41 = vsubps_avx(auVar41,auVar62);
              auVar52 = vfmadd231ps_fma(auVar62,auVar41,auVar114);
              auVar57 = vmulps_avx512vl(auVar41,auVar145);
              auVar216._8_8_ = auVar52._0_8_;
              auVar216._0_8_ = auVar52._0_8_;
              auVar41 = vshufpd_avx(auVar52,auVar52,3);
              auVar52 = vshufps_avx(auVar61,auVar61,0x55);
              auVar62 = vsubps_avx(auVar41,auVar216);
              auVar63 = vfmadd231ps_fma(auVar216,auVar52,auVar62);
              auVar230._8_8_ = auVar57._0_8_;
              auVar230._0_8_ = auVar57._0_8_;
              auVar41 = vshufpd_avx(auVar57,auVar57,3);
              auVar41 = vsubps_avx512vl(auVar41,auVar230);
              auVar41 = vfmadd213ps_avx512vl(auVar41,auVar52,auVar230);
              auVar115._0_8_ = auVar62._0_8_ ^ 0x8000000080000000;
              auVar115._8_4_ = auVar62._8_4_ ^ 0x80000000;
              auVar115._12_4_ = auVar62._12_4_ ^ 0x80000000;
              auVar52 = vmovshdup_avx512vl(auVar41);
              auVar231._0_8_ = auVar52._0_8_ ^ 0x8000000080000000;
              auVar231._8_4_ = auVar52._8_4_ ^ 0x80000000;
              auVar231._12_4_ = auVar52._12_4_ ^ 0x80000000;
              auVar57 = vmovshdup_avx512vl(auVar62);
              auVar58 = vpermt2ps_avx512vl(auVar231,ZEXT416(5),auVar62);
              auVar64 = vxorps_avx512vl(ZEXT416(5),ZEXT416(5));
              auVar243 = ZEXT1664(auVar64);
              auVar52 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar52._0_4_ * auVar62._0_4_)),auVar41,
                                            auVar57);
              auVar62 = vpermt2ps_avx512vl(auVar41,SUB6416(ZEXT464(4),0),auVar115);
              auVar139._0_4_ = auVar52._0_4_;
              auVar139._4_4_ = auVar139._0_4_;
              auVar139._8_4_ = auVar139._0_4_;
              auVar139._12_4_ = auVar139._0_4_;
              auVar41 = vdivps_avx(auVar58,auVar139);
              auVar65 = vdivps_avx512vl(auVar62,auVar139);
              fVar101 = auVar63._0_4_;
              auVar52 = vshufps_avx(auVar63,auVar63,0x55);
              auVar217._0_4_ = fVar101 * auVar41._0_4_ + auVar52._0_4_ * auVar65._0_4_;
              auVar217._4_4_ = fVar101 * auVar41._4_4_ + auVar52._4_4_ * auVar65._4_4_;
              auVar217._8_4_ = fVar101 * auVar41._8_4_ + auVar52._8_4_ * auVar65._8_4_;
              auVar217._12_4_ = fVar101 * auVar41._12_4_ + auVar52._12_4_ * auVar65._12_4_;
              auVar59 = vsubps_avx(auVar54,auVar217);
              auVar52 = vmovshdup_avx(auVar41);
              auVar54 = vinsertps_avx(auVar175,auVar206,0x1c);
              auVar232._0_4_ = auVar52._0_4_ * auVar54._0_4_;
              auVar232._4_4_ = auVar52._4_4_ * auVar54._4_4_;
              auVar232._8_4_ = auVar52._8_4_ * auVar54._8_4_;
              auVar232._12_4_ = auVar52._12_4_ * auVar54._12_4_;
              auVar60 = vinsertps_avx512f(auVar164,auVar194,0x1c);
              auVar52 = vmulps_avx512vl(auVar52,auVar60);
              auVar58 = vminps_avx512vl(auVar232,auVar52);
              auVar63 = vmaxps_avx(auVar52,auVar232);
              auVar57 = vmovshdup_avx(auVar65);
              auVar52 = vinsertps_avx(auVar206,auVar175,0x4c);
              auVar207._0_4_ = auVar57._0_4_ * auVar52._0_4_;
              auVar207._4_4_ = auVar57._4_4_ * auVar52._4_4_;
              auVar207._8_4_ = auVar57._8_4_ * auVar52._8_4_;
              auVar207._12_4_ = auVar57._12_4_ * auVar52._12_4_;
              auVar62 = vinsertps_avx(auVar194,auVar164,0x4c);
              auVar195._0_4_ = auVar57._0_4_ * auVar62._0_4_;
              auVar195._4_4_ = auVar57._4_4_ * auVar62._4_4_;
              auVar195._8_4_ = auVar57._8_4_ * auVar62._8_4_;
              auVar195._12_4_ = auVar57._12_4_ * auVar62._12_4_;
              auVar57 = vminps_avx(auVar207,auVar195);
              auVar58 = vaddps_avx512vl(auVar58,auVar57);
              auVar57 = vmaxps_avx(auVar195,auVar207);
              auVar196._0_4_ = auVar63._0_4_ + auVar57._0_4_;
              auVar196._4_4_ = auVar63._4_4_ + auVar57._4_4_;
              auVar196._8_4_ = auVar63._8_4_ + auVar57._8_4_;
              auVar196._12_4_ = auVar63._12_4_ + auVar57._12_4_;
              auVar208._8_8_ = 0x3f80000000000000;
              auVar208._0_8_ = 0x3f80000000000000;
              auVar63 = vsubps_avx(auVar208,auVar196);
              auVar57 = vsubps_avx(auVar208,auVar58);
              auVar58 = vsubps_avx(auVar53,auVar61);
              auVar61 = vsubps_avx(auVar56,auVar61);
              fVar201 = auVar58._0_4_;
              auVar233._0_4_ = fVar201 * auVar63._0_4_;
              fVar211 = auVar58._4_4_;
              auVar233._4_4_ = fVar211 * auVar63._4_4_;
              fVar212 = auVar58._8_4_;
              auVar233._8_4_ = fVar212 * auVar63._8_4_;
              fVar213 = auVar58._12_4_;
              auVar233._12_4_ = fVar213 * auVar63._12_4_;
              auVar66 = vbroadcastss_avx512vl(auVar41);
              auVar54 = vmulps_avx512vl(auVar66,auVar54);
              auVar60 = vmulps_avx512vl(auVar66,auVar60);
              auVar66 = vminps_avx512vl(auVar54,auVar60);
              auVar60 = vmaxps_avx512vl(auVar60,auVar54);
              auVar54 = vbroadcastss_avx512vl(auVar65);
              auVar52 = vmulps_avx512vl(auVar54,auVar52);
              auVar54 = vmulps_avx512vl(auVar54,auVar62);
              auVar62 = vminps_avx512vl(auVar52,auVar54);
              auVar62 = vaddps_avx512vl(auVar66,auVar62);
              auVar58 = vmulps_avx512vl(auVar58,auVar57);
              fVar101 = auVar61._0_4_;
              auVar197._0_4_ = fVar101 * auVar63._0_4_;
              fVar190 = auVar61._4_4_;
              auVar197._4_4_ = fVar190 * auVar63._4_4_;
              fVar199 = auVar61._8_4_;
              auVar197._8_4_ = fVar199 * auVar63._8_4_;
              fVar200 = auVar61._12_4_;
              auVar197._12_4_ = fVar200 * auVar63._12_4_;
              auVar209._0_4_ = fVar101 * auVar57._0_4_;
              auVar209._4_4_ = fVar190 * auVar57._4_4_;
              auVar209._8_4_ = fVar199 * auVar57._8_4_;
              auVar209._12_4_ = fVar200 * auVar57._12_4_;
              auVar54 = vmaxps_avx(auVar54,auVar52);
              auVar165._0_4_ = auVar60._0_4_ + auVar54._0_4_;
              auVar165._4_4_ = auVar60._4_4_ + auVar54._4_4_;
              auVar165._8_4_ = auVar60._8_4_ + auVar54._8_4_;
              auVar165._12_4_ = auVar60._12_4_ + auVar54._12_4_;
              auVar176._8_8_ = 0x3f800000;
              auVar176._0_8_ = 0x3f800000;
              auVar54 = vsubps_avx(auVar176,auVar165);
              auVar52 = vsubps_avx512vl(auVar176,auVar62);
              auVar227._0_4_ = fVar201 * auVar54._0_4_;
              auVar227._4_4_ = fVar211 * auVar54._4_4_;
              auVar227._8_4_ = fVar212 * auVar54._8_4_;
              auVar227._12_4_ = fVar213 * auVar54._12_4_;
              auVar218._0_4_ = fVar201 * auVar52._0_4_;
              auVar218._4_4_ = fVar211 * auVar52._4_4_;
              auVar218._8_4_ = fVar212 * auVar52._8_4_;
              auVar218._12_4_ = fVar213 * auVar52._12_4_;
              auVar166._0_4_ = fVar101 * auVar54._0_4_;
              auVar166._4_4_ = fVar190 * auVar54._4_4_;
              auVar166._8_4_ = fVar199 * auVar54._8_4_;
              auVar166._12_4_ = fVar200 * auVar54._12_4_;
              auVar177._0_4_ = fVar101 * auVar52._0_4_;
              auVar177._4_4_ = fVar190 * auVar52._4_4_;
              auVar177._8_4_ = fVar199 * auVar52._8_4_;
              auVar177._12_4_ = fVar200 * auVar52._12_4_;
              auVar54 = vminps_avx(auVar227,auVar218);
              auVar52 = vminps_avx512vl(auVar166,auVar177);
              auVar62 = vminps_avx512vl(auVar54,auVar52);
              auVar54 = vmaxps_avx(auVar218,auVar227);
              auVar52 = vmaxps_avx(auVar177,auVar166);
              auVar52 = vmaxps_avx(auVar52,auVar54);
              auVar63 = vminps_avx512vl(auVar233,auVar58);
              auVar54 = vminps_avx(auVar197,auVar209);
              auVar54 = vminps_avx(auVar63,auVar54);
              auVar54 = vhaddps_avx(auVar62,auVar54);
              auVar63 = vmaxps_avx512vl(auVar58,auVar233);
              auVar62 = vmaxps_avx(auVar209,auVar197);
              auVar62 = vmaxps_avx(auVar62,auVar63);
              auVar52 = vhaddps_avx(auVar52,auVar62);
              auVar54 = vshufps_avx(auVar54,auVar54,0xe8);
              auVar52 = vshufps_avx(auVar52,auVar52,0xe8);
              auVar167._0_4_ = auVar54._0_4_ + auVar59._0_4_;
              auVar167._4_4_ = auVar54._4_4_ + auVar59._4_4_;
              auVar167._8_4_ = auVar54._8_4_ + auVar59._8_4_;
              auVar167._12_4_ = auVar54._12_4_ + auVar59._12_4_;
              auVar178._0_4_ = auVar52._0_4_ + auVar59._0_4_;
              auVar178._4_4_ = auVar52._4_4_ + auVar59._4_4_;
              auVar178._8_4_ = auVar52._8_4_ + auVar59._8_4_;
              auVar178._12_4_ = auVar52._12_4_ + auVar59._12_4_;
              auVar54 = vmaxps_avx(auVar53,auVar167);
              auVar52 = vminps_avx(auVar178,auVar56);
              uVar35 = vcmpps_avx512vl(auVar52,auVar54,1);
              if ((uVar35 & 3) == 0) {
                uVar35 = vcmpps_avx512vl(auVar178,auVar56,1);
                uVar11 = vcmpps_avx512vl(auVar48,auVar167,1);
                if (((ushort)uVar11 & (ushort)uVar35 & 1) == 0) {
                  bVar26 = 0;
                }
                else {
                  auVar54 = vmovshdup_avx(auVar167);
                  bVar26 = auVar144._0_4_ < auVar54._0_4_ & (byte)(uVar35 >> 1) & 0x7f;
                }
                if (((3 < (uint)uVar28 || uVar6 != 0 && !bVar38) | bVar26) != 1) {
                  auVar41 = vinsertps_avx(auVar144,auVar55,0x10);
                  goto LAB_01c92d73;
                }
                lVar30 = 200;
                do {
                  auVar48 = vsubss_avx512f(auVar51,auVar59);
                  fVar199 = auVar48._0_4_;
                  fVar101 = fVar199 * fVar199 * fVar199;
                  fVar200 = auVar59._0_4_;
                  fVar190 = fVar200 * 3.0 * fVar199 * fVar199;
                  fVar199 = fVar199 * fVar200 * fVar200 * 3.0;
                  auVar127._4_4_ = fVar101;
                  auVar127._0_4_ = fVar101;
                  auVar127._8_4_ = fVar101;
                  auVar127._12_4_ = fVar101;
                  auVar122._4_4_ = fVar190;
                  auVar122._0_4_ = fVar190;
                  auVar122._8_4_ = fVar190;
                  auVar122._12_4_ = fVar190;
                  auVar103._4_4_ = fVar199;
                  auVar103._0_4_ = fVar199;
                  auVar103._8_4_ = fVar199;
                  auVar103._12_4_ = fVar199;
                  fVar200 = fVar200 * fVar200 * fVar200;
                  auVar149._0_4_ = fVar200 * (float)local_178._0_4_;
                  auVar149._4_4_ = fVar200 * (float)local_178._4_4_;
                  auVar149._8_4_ = fVar200 * fStack_170;
                  auVar149._12_4_ = fVar200 * fStack_16c;
                  auVar48 = vfmadd231ps_fma(auVar149,local_328,auVar103);
                  auVar48 = vfmadd231ps_fma(auVar48,auVar46,auVar122);
                  auVar48 = vfmadd231ps_fma(auVar48,auVar47,auVar127);
                  auVar104._8_8_ = auVar48._0_8_;
                  auVar104._0_8_ = auVar48._0_8_;
                  auVar48 = vshufpd_avx(auVar48,auVar48,3);
                  auVar54 = vshufps_avx(auVar59,auVar59,0x55);
                  auVar48 = vsubps_avx(auVar48,auVar104);
                  auVar54 = vfmadd213ps_fma(auVar48,auVar54,auVar104);
                  fVar101 = auVar54._0_4_;
                  auVar48 = vshufps_avx(auVar54,auVar54,0x55);
                  auVar105._0_4_ = auVar41._0_4_ * fVar101 + auVar65._0_4_ * auVar48._0_4_;
                  auVar105._4_4_ = auVar41._4_4_ * fVar101 + auVar65._4_4_ * auVar48._4_4_;
                  auVar105._8_4_ = auVar41._8_4_ * fVar101 + auVar65._8_4_ * auVar48._8_4_;
                  auVar105._12_4_ = auVar41._12_4_ * fVar101 + auVar65._12_4_ * auVar48._12_4_;
                  auVar59 = vsubps_avx(auVar59,auVar105);
                  auVar48 = vandps_avx512vl(auVar54,auVar236._0_16_);
                  auVar54 = vprolq_avx512vl(auVar48,0x20);
                  auVar48 = vmaxss_avx(auVar54,auVar48);
                  bVar38 = (float)local_188._0_4_ < auVar48._0_4_;
                  if (auVar48._0_4_ < (float)local_188._0_4_) {
                    auVar48 = vucomiss_avx512f(auVar64);
                    if (bVar38) break;
                    auVar41 = vucomiss_avx512f(auVar48);
                    auVar244 = ZEXT1664(auVar41);
                    if (bVar38) break;
                    vmovshdup_avx(auVar48);
                    auVar41 = vucomiss_avx512f(auVar64);
                    if (bVar38) break;
                    auVar54 = vucomiss_avx512f(auVar41);
                    auVar244 = ZEXT1664(auVar54);
                    if (bVar38) break;
                    auVar51 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                            ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c
                                           );
                    auVar61 = vinsertps_avx(auVar51,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128
                                                                  [2]),0x28);
                    auVar51 = vdpps_avx(auVar61,local_1a8,0x7f);
                    auVar52 = vdpps_avx(auVar61,local_1b8,0x7f);
                    auVar53 = vdpps_avx(auVar61,local_1c8,0x7f);
                    auVar62 = vdpps_avx(auVar61,local_1d8,0x7f);
                    auVar63 = vdpps_avx(auVar61,local_1e8,0x7f);
                    auVar57 = vdpps_avx(auVar61,local_1f8,0x7f);
                    auVar58 = vdpps_avx(auVar61,local_208,0x7f);
                    auVar61 = vdpps_avx(auVar61,local_218,0x7f);
                    auVar59 = vsubss_avx512f(auVar54,auVar41);
                    fVar200 = auVar41._0_4_;
                    auVar41 = vfmadd231ss_fma(ZEXT416((uint)(fVar200 * auVar63._0_4_)),auVar59,
                                              auVar51);
                    auVar51 = vfmadd231ss_fma(ZEXT416((uint)(auVar57._0_4_ * fVar200)),auVar59,
                                              auVar52);
                    auVar52 = vfmadd231ss_fma(ZEXT416((uint)(auVar58._0_4_ * fVar200)),auVar59,
                                              auVar53);
                    auVar53 = vfmadd231ss_fma(ZEXT416((uint)(fVar200 * auVar61._0_4_)),auVar59,
                                              auVar62);
                    auVar54 = vsubss_avx512f(auVar54,auVar48);
                    auVar179._0_4_ = auVar54._0_4_;
                    fVar101 = auVar179._0_4_ * auVar179._0_4_ * auVar179._0_4_;
                    local_d8 = auVar48._0_4_;
                    fVar190 = local_d8 * 3.0 * auVar179._0_4_ * auVar179._0_4_;
                    fVar199 = auVar179._0_4_ * local_d8 * local_d8 * 3.0;
                    fVar211 = local_d8 * local_d8 * local_d8;
                    auVar54 = vfmadd231ss_fma(ZEXT416((uint)(fVar211 * auVar53._0_4_)),
                                              ZEXT416((uint)fVar199),auVar52);
                    auVar54 = vfmadd231ss_fma(auVar54,ZEXT416((uint)fVar190),auVar51);
                    auVar41 = vfmadd231ss_fma(auVar54,ZEXT416((uint)fVar101),auVar41);
                    fVar201 = auVar41._0_4_;
                    if ((fVar201 < fVar119) ||
                       (fVar212 = *(float *)(ray + k * 4 + 0x80), fVar212 < fVar201)) break;
                    local_c8 = vshufps_avx(auVar48,auVar48,0x55);
                    auVar67 = vsubps_avx512vl(auVar67,local_c8);
                    fVar213 = local_c8._0_4_;
                    auVar184._0_4_ = fVar213 * (float)local_238._0_4_;
                    fVar214 = local_c8._4_4_;
                    auVar184._4_4_ = fVar214 * (float)local_238._4_4_;
                    fVar222 = local_c8._8_4_;
                    auVar184._8_4_ = fVar222 * fStack_230;
                    fVar223 = local_c8._12_4_;
                    auVar184._12_4_ = fVar223 * fStack_22c;
                    auVar198._0_4_ = fVar213 * (float)local_288._0_4_;
                    auVar198._4_4_ = fVar214 * (float)local_288._4_4_;
                    auVar198._8_4_ = fVar222 * fStack_280;
                    auVar198._12_4_ = fVar223 * fStack_27c;
                    auVar210._0_4_ = fVar213 * (float)local_298._0_4_;
                    auVar210._4_4_ = fVar214 * (float)local_298._4_4_;
                    auVar210._8_4_ = fVar222 * fStack_290;
                    auVar210._12_4_ = fVar223 * fStack_28c;
                    auVar219._0_4_ = fVar213 * (float)local_258._0_4_;
                    auVar219._4_4_ = fVar214 * (float)local_258._4_4_;
                    auVar219._8_4_ = fVar222 * fStack_250;
                    auVar219._12_4_ = fVar223 * fStack_24c;
                    auVar48 = vfmadd231ps_fma(auVar184,auVar67,local_228);
                    auVar41 = vfmadd231ps_fma(auVar198,auVar67,local_268);
                    auVar54 = vfmadd231ps_fma(auVar210,auVar67,local_278);
                    auVar67 = vfmadd231ps_fma(auVar219,auVar67,local_248);
                    auVar48 = vsubps_avx(auVar41,auVar48);
                    auVar41 = vsubps_avx(auVar54,auVar41);
                    auVar54 = vsubps_avx(auVar67,auVar54);
                    auVar220._0_4_ = local_d8 * auVar41._0_4_;
                    auVar220._4_4_ = local_d8 * auVar41._4_4_;
                    auVar220._8_4_ = local_d8 * auVar41._8_4_;
                    auVar220._12_4_ = local_d8 * auVar41._12_4_;
                    auVar179._4_4_ = auVar179._0_4_;
                    auVar179._8_4_ = auVar179._0_4_;
                    auVar179._12_4_ = auVar179._0_4_;
                    auVar48 = vfmadd231ps_fma(auVar220,auVar179,auVar48);
                    auVar185._0_4_ = local_d8 * auVar54._0_4_;
                    auVar185._4_4_ = local_d8 * auVar54._4_4_;
                    auVar185._8_4_ = local_d8 * auVar54._8_4_;
                    auVar185._12_4_ = local_d8 * auVar54._12_4_;
                    auVar41 = vfmadd231ps_fma(auVar185,auVar179,auVar41);
                    auVar186._0_4_ = local_d8 * auVar41._0_4_;
                    auVar186._4_4_ = local_d8 * auVar41._4_4_;
                    auVar186._8_4_ = local_d8 * auVar41._8_4_;
                    auVar186._12_4_ = local_d8 * auVar41._12_4_;
                    auVar48 = vfmadd231ps_fma(auVar186,auVar179,auVar48);
                    auVar48 = vmulps_avx512vl(auVar48,auVar145);
                    pGVar7 = (context->scene->geometries).items[uVar33].ptr;
                    if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) break;
                    auVar157._0_4_ = fVar211 * (float)local_2d8._0_4_;
                    auVar157._4_4_ = fVar211 * (float)local_2d8._4_4_;
                    auVar157._8_4_ = fVar211 * fStack_2d0;
                    auVar157._12_4_ = fVar211 * fStack_2cc;
                    auVar150._4_4_ = fVar199;
                    auVar150._0_4_ = fVar199;
                    auVar150._8_4_ = fVar199;
                    auVar150._12_4_ = fVar199;
                    auVar41 = vfmadd132ps_fma(auVar150,auVar157,local_2c8);
                    auVar140._4_4_ = fVar190;
                    auVar140._0_4_ = fVar190;
                    auVar140._8_4_ = fVar190;
                    auVar140._12_4_ = fVar190;
                    auVar41 = vfmadd132ps_fma(auVar140,auVar41,local_2b8);
                    auVar128._4_4_ = fVar101;
                    auVar128._0_4_ = fVar101;
                    auVar128._8_4_ = fVar101;
                    auVar128._12_4_ = fVar101;
                    auVar67 = vfmadd132ps_fma(auVar128,auVar41,local_2a8);
                    auVar41 = vshufps_avx(auVar67,auVar67,0xc9);
                    auVar54 = vshufps_avx(auVar48,auVar48,0xc9);
                    auVar129._0_4_ = auVar67._0_4_ * auVar54._0_4_;
                    auVar129._4_4_ = auVar67._4_4_ * auVar54._4_4_;
                    auVar129._8_4_ = auVar67._8_4_ * auVar54._8_4_;
                    auVar129._12_4_ = auVar67._12_4_ * auVar54._12_4_;
                    auVar48 = vfmsub231ps_fma(auVar129,auVar48,auVar41);
                    local_e8 = auVar48._0_4_;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x80) = fVar201;
                      uVar109 = vextractps_avx(auVar48,1);
                      *(undefined4 *)(ray + k * 4 + 0xc0) = uVar109;
                      uVar109 = vextractps_avx(auVar48,2);
                      *(undefined4 *)(ray + k * 4 + 0xd0) = uVar109;
                      *(undefined4 *)(ray + k * 4 + 0xe0) = local_e8;
                      *(float *)(ray + k * 4 + 0xf0) = local_d8;
                      *(float *)(ray + k * 4 + 0x100) = fVar200;
                      *(uint *)(ray + k * 4 + 0x110) = uVar5;
                      *(uint *)(ray + k * 4 + 0x120) = uVar33;
                      *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      break;
                    }
                    auVar41 = vshufps_avx(auVar48,auVar48,0x55);
                    local_f8 = vshufps_avx(auVar48,auVar48,0xaa);
                    local_108[0] = (RTCHitN)auVar41[0];
                    local_108[1] = (RTCHitN)auVar41[1];
                    local_108[2] = (RTCHitN)auVar41[2];
                    local_108[3] = (RTCHitN)auVar41[3];
                    local_108[4] = (RTCHitN)auVar41[4];
                    local_108[5] = (RTCHitN)auVar41[5];
                    local_108[6] = (RTCHitN)auVar41[6];
                    local_108[7] = (RTCHitN)auVar41[7];
                    local_108[8] = (RTCHitN)auVar41[8];
                    local_108[9] = (RTCHitN)auVar41[9];
                    local_108[10] = (RTCHitN)auVar41[10];
                    local_108[0xb] = (RTCHitN)auVar41[0xb];
                    local_108[0xc] = (RTCHitN)auVar41[0xc];
                    local_108[0xd] = (RTCHitN)auVar41[0xd];
                    local_108[0xe] = (RTCHitN)auVar41[0xe];
                    local_108[0xf] = (RTCHitN)auVar41[0xf];
                    uStack_e4 = local_e8;
                    uStack_e0 = local_e8;
                    uStack_dc = local_e8;
                    fStack_d4 = local_d8;
                    fStack_d0 = local_d8;
                    fStack_cc = local_d8;
                    local_b8 = local_2f8._0_8_;
                    uStack_b0 = local_2f8._8_8_;
                    local_a8 = local_2e8;
                    vpcmpeqd_avx2(ZEXT1632(local_2e8),ZEXT1632(local_2e8));
                    uStack_94 = context->user->instID[0];
                    local_98 = uStack_94;
                    uStack_90 = uStack_94;
                    uStack_8c = uStack_94;
                    uStack_88 = context->user->instPrimID[0];
                    uStack_84 = uStack_88;
                    uStack_80 = uStack_88;
                    uStack_7c = uStack_88;
                    *(float *)(ray + k * 4 + 0x80) = fVar201;
                    local_368 = local_308;
                    local_358.valid = (int *)local_368;
                    local_358.geometryUserPtr = pGVar7->userPtr;
                    local_358.context = context->user;
                    local_358.hit = local_108;
                    local_358.N = 4;
                    local_358.ray = (RTCRayN *)ray;
                    if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar7->intersectionFilterN)(&local_358);
                      auVar48 = vxorps_avx512vl(auVar64,auVar64);
                      auVar243 = ZEXT1664(auVar48);
                      auVar244 = ZEXT464(0x3f800000);
                      auVar241 = ZEXT3264(_DAT_01feed20);
                      auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar240 = ZEXT1664(auVar48);
                      auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                      auVar239 = ZEXT1664(auVar48);
                      auVar73 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar238 = ZEXT3264(auVar73);
                      auVar48 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                      auVar237 = ZEXT1664(auVar48);
                      auVar48 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar236 = ZEXT1664(auVar48);
                      auVar48 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar235 = ZEXT1664(auVar48);
                      auVar73 = vbroadcastss_avx512vl(ZEXT416(2));
                      auVar242 = ZEXT3264(auVar73);
                    }
                    auVar48 = auVar243._0_16_;
                    uVar35 = vptestmd_avx512vl(local_368,local_368);
                    if ((uVar35 & 0xf) != 0) {
                      p_Var8 = context->args->filter;
                      if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var8)(&local_358);
                        auVar48 = vxorps_avx512vl(auVar48,auVar48);
                        auVar243 = ZEXT1664(auVar48);
                        auVar244 = ZEXT464(0x3f800000);
                        auVar241 = ZEXT3264(_DAT_01feed20);
                        auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar240 = ZEXT1664(auVar48);
                        auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                        auVar239 = ZEXT1664(auVar48);
                        auVar73 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                        auVar238 = ZEXT3264(auVar73);
                        auVar48 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                        auVar237 = ZEXT1664(auVar48);
                        auVar48 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar236 = ZEXT1664(auVar48);
                        auVar48 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                        auVar235 = ZEXT1664(auVar48);
                        auVar73 = vbroadcastss_avx512vl(ZEXT416(2));
                        auVar242 = ZEXT3264(auVar73);
                      }
                      uVar35 = vptestmd_avx512vl(local_368,local_368);
                      uVar35 = uVar35 & 0xf;
                      bVar26 = (byte)uVar35;
                      if (bVar26 != 0) {
                        iVar23 = *(int *)(local_358.hit + 4);
                        iVar24 = *(int *)(local_358.hit + 8);
                        iVar25 = *(int *)(local_358.hit + 0xc);
                        bVar38 = (bool)((byte)(uVar35 >> 1) & 1);
                        bVar39 = (bool)((byte)(uVar35 >> 2) & 1);
                        bVar36 = SUB81(uVar35 >> 3,0);
                        *(uint *)(local_358.ray + 0xc0) =
                             (uint)(bVar26 & 1) * *(int *)local_358.hit |
                             (uint)!(bool)(bVar26 & 1) * *(int *)(local_358.ray + 0xc0);
                        *(uint *)(local_358.ray + 0xc4) =
                             (uint)bVar38 * iVar23 | (uint)!bVar38 * *(int *)(local_358.ray + 0xc4);
                        *(uint *)(local_358.ray + 200) =
                             (uint)bVar39 * iVar24 | (uint)!bVar39 * *(int *)(local_358.ray + 200);
                        *(uint *)(local_358.ray + 0xcc) =
                             (uint)bVar36 * iVar25 | (uint)!bVar36 * *(int *)(local_358.ray + 0xcc);
                        iVar23 = *(int *)(local_358.hit + 0x14);
                        iVar24 = *(int *)(local_358.hit + 0x18);
                        iVar25 = *(int *)(local_358.hit + 0x1c);
                        bVar38 = (bool)((byte)(uVar35 >> 1) & 1);
                        bVar39 = (bool)((byte)(uVar35 >> 2) & 1);
                        bVar36 = SUB81(uVar35 >> 3,0);
                        *(uint *)(local_358.ray + 0xd0) =
                             (uint)(bVar26 & 1) * *(int *)(local_358.hit + 0x10) |
                             (uint)!(bool)(bVar26 & 1) * *(int *)(local_358.ray + 0xd0);
                        *(uint *)(local_358.ray + 0xd4) =
                             (uint)bVar38 * iVar23 | (uint)!bVar38 * *(int *)(local_358.ray + 0xd4);
                        *(uint *)(local_358.ray + 0xd8) =
                             (uint)bVar39 * iVar24 | (uint)!bVar39 * *(int *)(local_358.ray + 0xd8);
                        *(uint *)(local_358.ray + 0xdc) =
                             (uint)bVar36 * iVar25 | (uint)!bVar36 * *(int *)(local_358.ray + 0xdc);
                        iVar23 = *(int *)(local_358.hit + 0x24);
                        iVar24 = *(int *)(local_358.hit + 0x28);
                        iVar25 = *(int *)(local_358.hit + 0x2c);
                        bVar38 = (bool)((byte)(uVar35 >> 1) & 1);
                        bVar39 = (bool)((byte)(uVar35 >> 2) & 1);
                        bVar36 = SUB81(uVar35 >> 3,0);
                        *(uint *)(local_358.ray + 0xe0) =
                             (uint)(bVar26 & 1) * *(int *)(local_358.hit + 0x20) |
                             (uint)!(bool)(bVar26 & 1) * *(int *)(local_358.ray + 0xe0);
                        *(uint *)(local_358.ray + 0xe4) =
                             (uint)bVar38 * iVar23 | (uint)!bVar38 * *(int *)(local_358.ray + 0xe4);
                        *(uint *)(local_358.ray + 0xe8) =
                             (uint)bVar39 * iVar24 | (uint)!bVar39 * *(int *)(local_358.ray + 0xe8);
                        *(uint *)(local_358.ray + 0xec) =
                             (uint)bVar36 * iVar25 | (uint)!bVar36 * *(int *)(local_358.ray + 0xec);
                        iVar23 = *(int *)(local_358.hit + 0x34);
                        iVar24 = *(int *)(local_358.hit + 0x38);
                        iVar25 = *(int *)(local_358.hit + 0x3c);
                        bVar38 = (bool)((byte)(uVar35 >> 1) & 1);
                        bVar39 = (bool)((byte)(uVar35 >> 2) & 1);
                        bVar36 = SUB81(uVar35 >> 3,0);
                        *(uint *)(local_358.ray + 0xf0) =
                             (uint)(bVar26 & 1) * *(int *)(local_358.hit + 0x30) |
                             (uint)!(bool)(bVar26 & 1) * *(int *)(local_358.ray + 0xf0);
                        *(uint *)(local_358.ray + 0xf4) =
                             (uint)bVar38 * iVar23 | (uint)!bVar38 * *(int *)(local_358.ray + 0xf4);
                        *(uint *)(local_358.ray + 0xf8) =
                             (uint)bVar39 * iVar24 | (uint)!bVar39 * *(int *)(local_358.ray + 0xf8);
                        *(uint *)(local_358.ray + 0xfc) =
                             (uint)bVar36 * iVar25 | (uint)!bVar36 * *(int *)(local_358.ray + 0xfc);
                        iVar23 = *(int *)(local_358.hit + 0x44);
                        iVar24 = *(int *)(local_358.hit + 0x48);
                        iVar25 = *(int *)(local_358.hit + 0x4c);
                        bVar38 = (bool)((byte)(uVar35 >> 1) & 1);
                        bVar39 = (bool)((byte)(uVar35 >> 2) & 1);
                        bVar36 = SUB81(uVar35 >> 3,0);
                        *(uint *)(local_358.ray + 0x100) =
                             (uint)(bVar26 & 1) * *(int *)(local_358.hit + 0x40) |
                             (uint)!(bool)(bVar26 & 1) * *(int *)(local_358.ray + 0x100);
                        *(uint *)(local_358.ray + 0x104) =
                             (uint)bVar38 * iVar23 | (uint)!bVar38 * *(int *)(local_358.ray + 0x104)
                        ;
                        *(uint *)(local_358.ray + 0x108) =
                             (uint)bVar39 * iVar24 | (uint)!bVar39 * *(int *)(local_358.ray + 0x108)
                        ;
                        *(uint *)(local_358.ray + 0x10c) =
                             (uint)bVar36 * iVar25 | (uint)!bVar36 * *(int *)(local_358.ray + 0x10c)
                        ;
                        auVar48 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_358.hit + 0x50));
                        *(undefined1 (*) [16])(local_358.ray + 0x110) = auVar48;
                        auVar48 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_358.hit + 0x60));
                        *(undefined1 (*) [16])(local_358.ray + 0x120) = auVar48;
                        auVar48 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_358.hit + 0x70));
                        *(undefined1 (*) [16])(local_358.ray + 0x130) = auVar48;
                        auVar48 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_358.hit + 0x80));
                        *(undefined1 (*) [16])(local_358.ray + 0x140) = auVar48;
                        break;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x80) = fVar212;
                    break;
                  }
                  lVar30 = lVar30 + -1;
                } while (lVar30 != 0);
              }
            }
          }
          if ((uint)uVar28 == 0) break;
        } while( true );
      }
      uVar109 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar16._4_4_ = uVar109;
      auVar16._0_4_ = uVar109;
      auVar16._8_4_ = uVar109;
      auVar16._12_4_ = uVar109;
      auVar16._16_4_ = uVar109;
      auVar16._20_4_ = uVar109;
      auVar16._24_4_ = uVar109;
      auVar16._28_4_ = uVar109;
      uVar11 = vcmpps_avx512vl(local_78,auVar16,2);
      uVar33 = (uint)uVar34 & (uint)uVar11;
      uVar34 = (ulong)uVar33;
    } while (uVar33 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }